

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  int iVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  long lVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  ulong uVar60;
  long lVar61;
  RayK<16> *pRVar62;
  byte bVar63;
  long lVar64;
  bool bVar65;
  ulong uVar66;
  ulong uVar67;
  uint uVar68;
  Geometry *geometry;
  long lVar69;
  ulong uVar70;
  float fVar71;
  float fVar120;
  float fVar122;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar72;
  undefined1 auVar83 [16];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined4 uVar126;
  vint4 bi_2;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar144;
  float fVar152;
  float fVar153;
  vint4 ai_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar154;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar155;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar156;
  float fVar163;
  float fVar164;
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar165;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vint4 ai;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  vint4 ai_1;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  bool local_a11;
  RTCFilterFunctionNArguments local_9d0;
  undefined4 local_9a0;
  undefined4 uStack_99c;
  undefined8 uStack_998;
  undefined1 local_990 [16];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  float local_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  LinearSpace3fa *local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined4 local_6c0;
  int local_6bc;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  byte local_670;
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [64];
  undefined8 local_5a0;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined1 local_510 [16];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar6 = prim[1];
  uVar60 = (ulong)(byte)PVar6;
  fVar156 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar81 = vsubps_avx(auVar81,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar145._0_4_ = fVar156 * auVar81._0_4_;
  auVar145._4_4_ = fVar156 * auVar81._4_4_;
  auVar145._8_4_ = fVar156 * auVar81._8_4_;
  auVar145._12_4_ = fVar156 * auVar81._12_4_;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar83._0_4_ = fVar156 * auVar79._0_4_;
  auVar83._4_4_ = fVar156 * auVar79._4_4_;
  auVar83._8_4_ = fVar156 * auVar79._8_4_;
  auVar83._12_4_ = fVar156 * auVar79._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar60 + 6)));
  uVar70 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + uVar60 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar66 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar179._4_4_ = auVar83._0_4_;
  auVar179._0_4_ = auVar83._0_4_;
  auVar179._8_4_ = auVar83._0_4_;
  auVar179._12_4_ = auVar83._0_4_;
  auVar82 = vshufps_avx(auVar83,auVar83,0x55);
  auVar76 = vshufps_avx(auVar83,auVar83,0xaa);
  fVar156 = auVar76._0_4_;
  auVar157._0_4_ = fVar156 * auVar73._0_4_;
  fVar163 = auVar76._4_4_;
  auVar157._4_4_ = fVar163 * auVar73._4_4_;
  fVar164 = auVar76._8_4_;
  auVar157._8_4_ = fVar164 * auVar73._8_4_;
  fVar165 = auVar76._12_4_;
  auVar157._12_4_ = fVar165 * auVar73._12_4_;
  auVar136._0_4_ = auVar74._0_4_ * fVar156;
  auVar136._4_4_ = auVar74._4_4_ * fVar163;
  auVar136._8_4_ = auVar74._8_4_ * fVar164;
  auVar136._12_4_ = auVar74._12_4_ * fVar165;
  auVar127._0_4_ = auVar75._0_4_ * fVar156;
  auVar127._4_4_ = auVar75._4_4_ * fVar163;
  auVar127._8_4_ = auVar75._8_4_ * fVar164;
  auVar127._12_4_ = auVar75._12_4_ * fVar165;
  auVar76 = vfmadd231ps_fma(auVar157,auVar82,auVar79);
  auVar78 = vfmadd231ps_fma(auVar136,auVar82,auVar16);
  auVar82 = vfmadd231ps_fma(auVar127,auVar18,auVar82);
  auVar77 = vfmadd231ps_fma(auVar76,auVar179,auVar81);
  auVar78 = vfmadd231ps_fma(auVar78,auVar179,auVar80);
  auVar83 = vfmadd231ps_fma(auVar82,auVar17,auVar179);
  auVar180._4_4_ = auVar145._0_4_;
  auVar180._0_4_ = auVar145._0_4_;
  auVar180._8_4_ = auVar145._0_4_;
  auVar180._12_4_ = auVar145._0_4_;
  auVar82 = vshufps_avx(auVar145,auVar145,0x55);
  auVar76 = vshufps_avx(auVar145,auVar145,0xaa);
  auVar73 = vmulps_avx512vl(auVar76,auVar73);
  auVar146._0_4_ = auVar76._0_4_ * auVar74._0_4_;
  auVar146._4_4_ = auVar76._4_4_ * auVar74._4_4_;
  auVar146._8_4_ = auVar76._8_4_ * auVar74._8_4_;
  auVar146._12_4_ = auVar76._12_4_ * auVar74._12_4_;
  auVar139._0_4_ = auVar76._0_4_ * auVar75._0_4_;
  auVar139._4_4_ = auVar76._4_4_ * auVar75._4_4_;
  auVar139._8_4_ = auVar76._8_4_ * auVar75._8_4_;
  auVar139._12_4_ = auVar76._12_4_ * auVar75._12_4_;
  auVar74 = vfmadd231ps_avx512vl(auVar73,auVar82,auVar79);
  auVar79 = vfmadd231ps_fma(auVar146,auVar82,auVar16);
  auVar73 = vfmadd231ps_fma(auVar139,auVar82,auVar18);
  auVar75 = vfmadd231ps_avx512vl(auVar74,auVar180,auVar81);
  auVar74 = vfmadd231ps_fma(auVar79,auVar180,auVar80);
  auVar18 = vfmadd231ps_fma(auVar73,auVar180,auVar17);
  auVar173._8_4_ = 0x7fffffff;
  auVar173._0_8_ = 0x7fffffff7fffffff;
  auVar173._12_4_ = 0x7fffffff;
  auVar81 = vandps_avx(auVar77,auVar173);
  auVar171._8_4_ = 0x219392ef;
  auVar171._0_8_ = 0x219392ef219392ef;
  auVar171._12_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar81,auVar171,1);
  bVar65 = (bool)((byte)uVar70 & 1);
  auVar76._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar77._0_4_;
  bVar65 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar77._4_4_;
  bVar65 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar77._8_4_;
  bVar65 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar77._12_4_;
  auVar81 = vandps_avx(auVar78,auVar173);
  uVar70 = vcmpps_avx512vl(auVar81,auVar171,1);
  bVar65 = (bool)((byte)uVar70 & 1);
  auVar77._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar78._0_4_;
  bVar65 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar78._4_4_;
  bVar65 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar78._8_4_;
  bVar65 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar78._12_4_;
  auVar81 = vandps_avx(auVar83,auVar173);
  uVar70 = vcmpps_avx512vl(auVar81,auVar171,1);
  bVar65 = (bool)((byte)uVar70 & 1);
  auVar78._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar83._0_4_;
  bVar65 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar83._4_4_;
  bVar65 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar83._8_4_;
  bVar65 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar83._12_4_;
  auVar79 = vrcp14ps_avx512vl(auVar76);
  auVar172._8_4_ = 0x3f800000;
  auVar172._0_8_ = &DAT_3f8000003f800000;
  auVar172._12_4_ = 0x3f800000;
  auVar81 = vfnmadd213ps_fma(auVar76,auVar79,auVar172);
  auVar73 = vfmadd132ps_fma(auVar81,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar77);
  auVar81 = vfnmadd213ps_fma(auVar77,auVar79,auVar172);
  auVar16 = vfmadd132ps_fma(auVar81,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar78);
  auVar81 = vfnmadd213ps_fma(auVar78,auVar79,auVar172);
  auVar17 = vfmadd132ps_fma(auVar81,auVar79,auVar79);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vsubps_avx512vl(auVar81,auVar75);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar81 = vpmovsxwd_avx(auVar79);
  auVar166._0_4_ = auVar73._0_4_ * auVar80._0_4_;
  auVar166._4_4_ = auVar73._4_4_ * auVar80._4_4_;
  auVar166._8_4_ = auVar73._8_4_ * auVar80._8_4_;
  auVar166._12_4_ = auVar73._12_4_ * auVar80._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx512vl(auVar81,auVar75);
  auVar158._0_4_ = auVar73._0_4_ * auVar81._0_4_;
  auVar158._4_4_ = auVar73._4_4_ * auVar81._4_4_;
  auVar158._8_4_ = auVar73._8_4_ * auVar81._8_4_;
  auVar158._12_4_ = auVar73._12_4_ * auVar81._12_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar79 = vpmovsxwd_avx(auVar73);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar60 * -2 + 6);
  auVar81 = vpmovsxwd_avx(auVar80);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar74);
  auVar174._0_4_ = auVar16._0_4_ * auVar81._0_4_;
  auVar174._4_4_ = auVar16._4_4_ * auVar81._4_4_;
  auVar174._8_4_ = auVar16._8_4_ * auVar81._8_4_;
  auVar174._12_4_ = auVar16._12_4_ * auVar81._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar79);
  auVar81 = vsubps_avx(auVar81,auVar74);
  auVar137._0_4_ = auVar16._0_4_ * auVar81._0_4_;
  auVar137._4_4_ = auVar16._4_4_ * auVar81._4_4_;
  auVar137._8_4_ = auVar16._8_4_ * auVar81._8_4_;
  auVar137._12_4_ = auVar16._12_4_ * auVar81._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar66 + uVar60 + 6);
  auVar81 = vpmovsxwd_avx(auVar16);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar18);
  auVar147._0_4_ = auVar17._0_4_ * auVar81._0_4_;
  auVar147._4_4_ = auVar17._4_4_ * auVar81._4_4_;
  auVar147._8_4_ = auVar17._8_4_ * auVar81._8_4_;
  auVar147._12_4_ = auVar17._12_4_ * auVar81._12_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar81 = vpmovsxwd_avx(auVar74);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar18);
  auVar128._0_4_ = auVar17._0_4_ * auVar81._0_4_;
  auVar128._4_4_ = auVar17._4_4_ * auVar81._4_4_;
  auVar128._8_4_ = auVar17._8_4_ * auVar81._8_4_;
  auVar128._12_4_ = auVar17._12_4_ * auVar81._12_4_;
  auVar81 = vpminsd_avx(auVar166,auVar158);
  auVar79 = vpminsd_avx(auVar174,auVar137);
  auVar81 = vmaxps_avx(auVar81,auVar79);
  auVar79 = vpminsd_avx(auVar147,auVar128);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar17._4_4_ = uVar126;
  auVar17._0_4_ = uVar126;
  auVar17._8_4_ = uVar126;
  auVar17._12_4_ = uVar126;
  auVar79 = vmaxps_avx512vl(auVar79,auVar17);
  auVar81 = vmaxps_avx(auVar81,auVar79);
  auVar18._8_4_ = 0x3f7ffffa;
  auVar18._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar18._12_4_ = 0x3f7ffffa;
  local_510 = vmulps_avx512vl(auVar81,auVar18);
  auVar81 = vpmaxsd_avx(auVar166,auVar158);
  auVar79 = vpmaxsd_avx(auVar174,auVar137);
  auVar81 = vminps_avx(auVar81,auVar79);
  auVar79 = vpmaxsd_avx(auVar147,auVar128);
  uVar126 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar75._4_4_ = uVar126;
  auVar75._0_4_ = uVar126;
  auVar75._8_4_ = uVar126;
  auVar75._12_4_ = uVar126;
  auVar79 = vminps_avx512vl(auVar79,auVar75);
  auVar81 = vminps_avx(auVar81,auVar79);
  auVar82._8_4_ = 0x3f800003;
  auVar82._0_8_ = 0x3f8000033f800003;
  auVar82._12_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar82);
  auVar79 = vpbroadcastd_avx512vl();
  uVar19 = vcmpps_avx512vl(local_510,auVar81,2);
  uVar70 = vpcmpgtd_avx512vl(auVar79,_DAT_01ff0cf0);
  uVar70 = ((byte)uVar19 & 0xf) & uVar70;
  local_a11 = (char)uVar70 != '\0';
  if (local_a11) {
    local_8e8 = pre->ray_space + k;
    auVar135 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar135);
    do {
      auVar135 = local_440;
      lVar69 = 0;
      for (uVar60 = uVar70; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
        lVar69 = lVar69 + 1;
      }
      uVar68 = *(uint *)(prim + 2);
      pGVar8 = (context->scene->geometries).items[uVar68].ptr;
      uVar60 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               (ulong)*(uint *)(prim + lVar69 * 4 + 6) *
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar61 = (long)pGVar8[1].intersectionFilterN * uVar60;
      lVar69 = *(long *)&pGVar8[1].time_range.upper;
      local_990 = *(undefined1 (*) [16])(lVar69 + lVar61);
      lVar64 = (long)pGVar8[1].intersectionFilterN * (uVar60 + 1);
      local_7a0 = *(undefined1 (*) [16])(lVar69 + lVar64);
      iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar53 = (long)iVar7 * 0x44;
      auVar140._8_4_ = 0xbeaaaaab;
      auVar140._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar140._12_4_ = 0xbeaaaaab;
      local_790 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar8[2].intersectionFilterN +
                                    uVar60 * (long)pGVar8[2].pointQueryFunc),local_990,auVar140);
      local_7b0 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar8[2].intersectionFilterN +
                                   (long)pGVar8[2].pointQueryFunc * (uVar60 + 1)),local_7a0,auVar140
                                 );
      auVar73 = vsubps_avx(local_990,auVar81);
      uVar126 = auVar73._0_4_;
      auVar141._4_4_ = uVar126;
      auVar141._0_4_ = uVar126;
      auVar141._8_4_ = uVar126;
      auVar141._12_4_ = uVar126;
      auVar79 = vshufps_avx(auVar73,auVar73,0x55);
      aVar4 = (local_8e8->vx).field_0;
      aVar5 = (local_8e8->vy).field_0;
      fVar156 = (local_8e8->vz).field_0.m128[0];
      fVar163 = *(float *)((long)&(local_8e8->vz).field_0 + 4);
      fVar164 = *(float *)((long)&(local_8e8->vz).field_0 + 8);
      fVar165 = *(float *)((long)&(local_8e8->vz).field_0 + 0xc);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar177._0_4_ = fVar156 * auVar73._0_4_;
      auVar177._4_4_ = fVar163 * auVar73._4_4_;
      auVar177._8_4_ = fVar164 * auVar73._8_4_;
      auVar177._12_4_ = fVar165 * auVar73._12_4_;
      auVar79 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar5,auVar79);
      auVar80 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar141);
      auVar73 = vsubps_avx(local_790,auVar81);
      uVar126 = auVar73._0_4_;
      auVar142._4_4_ = uVar126;
      auVar142._0_4_ = uVar126;
      auVar142._8_4_ = uVar126;
      auVar142._12_4_ = uVar126;
      auVar79 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar178._0_4_ = fVar156 * auVar73._0_4_;
      auVar178._4_4_ = fVar163 * auVar73._4_4_;
      auVar178._8_4_ = fVar164 * auVar73._8_4_;
      auVar178._12_4_ = fVar165 * auVar73._12_4_;
      auVar79 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar5,auVar79);
      auVar16 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar142);
      auVar73 = vsubps_avx(local_7b0,auVar81);
      uVar126 = auVar73._0_4_;
      auVar143._4_4_ = uVar126;
      auVar143._0_4_ = uVar126;
      auVar143._8_4_ = uVar126;
      auVar143._12_4_ = uVar126;
      auVar79 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar181._0_4_ = fVar156 * auVar73._0_4_;
      auVar181._4_4_ = fVar163 * auVar73._4_4_;
      auVar181._8_4_ = fVar164 * auVar73._8_4_;
      auVar181._12_4_ = fVar165 * auVar73._12_4_;
      auVar79 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar5,auVar79);
      auVar73 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar143);
      auVar79 = vsubps_avx(local_7a0,auVar81);
      uVar126 = auVar79._0_4_;
      auVar138._4_4_ = uVar126;
      auVar138._0_4_ = uVar126;
      auVar138._8_4_ = uVar126;
      auVar138._12_4_ = uVar126;
      auVar81 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar182._0_4_ = fVar156 * auVar79._0_4_;
      auVar182._4_4_ = fVar163 * auVar79._4_4_;
      auVar182._8_4_ = fVar164 * auVar79._8_4_;
      auVar182._12_4_ = fVar165 * auVar79._12_4_;
      auVar81 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar5,auVar81);
      auVar74 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar138);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar53);
      uVar126 = auVar80._0_4_;
      local_7e0._4_4_ = uVar126;
      local_7e0._0_4_ = uVar126;
      local_7e0._8_4_ = uVar126;
      local_7e0._12_4_ = uVar126;
      local_7e0._16_4_ = uVar126;
      local_7e0._20_4_ = uVar126;
      local_7e0._24_4_ = uVar126;
      local_7e0._28_4_ = uVar126;
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x484);
      auVar84._8_4_ = 1;
      auVar84._0_8_ = 0x100000001;
      auVar84._12_4_ = 1;
      auVar84._16_4_ = 1;
      auVar84._20_4_ = 1;
      auVar84._24_4_ = 1;
      auVar84._28_4_ = 1;
      local_740 = vpermps_avx512vl(auVar84,ZEXT1632(auVar80));
      local_800 = vbroadcastss_avx512vl(auVar16);
      local_940 = vpermps_avx512vl(auVar84,ZEXT1632(auVar16));
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x908);
      local_820 = vbroadcastss_avx512vl(auVar73);
      auVar188 = ZEXT3264(local_820);
      local_840 = vpermps_avx512vl(auVar84,ZEXT1632(auVar73));
      auVar189 = ZEXT3264(local_840);
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0xd8c);
      local_860 = vbroadcastss_avx512vl(auVar74);
      auVar190 = ZEXT3264(local_860);
      local_880 = vpermps_avx512vl(auVar84,ZEXT1632(auVar74));
      auVar191 = ZEXT3264(local_880);
      auVar84 = vmulps_avx512vl(local_860,auVar97);
      auVar85 = vmulps_avx512vl(local_880,auVar97);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar98,local_820);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,local_840);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar100,local_800);
      auVar86 = vfmadd231ps_avx512vl(auVar85,auVar100,local_940);
      auVar17 = vfmadd231ps_fma(auVar84,auVar99,local_7e0);
      auVar84 = *(undefined1 (*) [32])(bezier_basis1 + lVar53);
      auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x484);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x908);
      auVar87 = vfmadd231ps_avx512vl(auVar86,auVar99,local_740);
      auVar86 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0xd8c);
      auVar88 = vmulps_avx512vl(local_860,auVar86);
      auVar89 = vmulps_avx512vl(local_880,auVar86);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar96,local_820);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar96,local_840);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar85,local_800);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar85,local_940);
      auVar18 = vfmadd231ps_fma(auVar88,auVar84,local_7e0);
      auVar88 = vfmadd231ps_avx512vl(auVar89,auVar84,local_740);
      auVar89 = vsubps_avx512vl(ZEXT1632(auVar18),ZEXT1632(auVar17));
      auVar90 = vsubps_avx512vl(auVar88,auVar87);
      auVar91 = vmulps_avx512vl(auVar87,auVar89);
      auVar92 = vmulps_avx512vl(ZEXT1632(auVar17),auVar90);
      auVar91 = vsubps_avx512vl(auVar91,auVar92);
      auVar81 = vshufps_avx(local_790,local_790,0xff);
      local_320 = vbroadcastsd_avx512vl(auVar81);
      auVar81 = vshufps_avx(local_7b0,local_7b0,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar81);
      _local_360 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar69 + 0xc + lVar64)));
      auVar92 = vmulps_avx512vl(_local_360,auVar97);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_340);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar100,local_320);
      local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar69 + 0xc + lVar61)));
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_380);
      auVar93 = vmulps_avx512vl(_local_360,auVar86);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,local_340);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar85,local_320);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar84,local_380);
      auVar94 = vmulps_avx512vl(auVar90,auVar90);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar89);
      auVar95 = vmaxps_avx512vl(auVar92,auVar93);
      auVar95 = vmulps_avx512vl(auVar95,auVar95);
      auVar94 = vmulps_avx512vl(auVar95,auVar94);
      auVar91 = vmulps_avx512vl(auVar91,auVar91);
      uVar19 = vcmpps_avx512vl(auVar91,auVar94,2);
      auVar81 = vinsertps_avx512f(auVar80,local_380._0_16_,0x30);
      auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar75 = vandps_avx512vl(auVar81,auVar79);
      auVar81 = vblendps_avx(auVar16,local_790,8);
      auVar81 = vandps_avx512vl(auVar81,auVar79);
      auVar75 = vmaxps_avx512vl(auVar75,auVar81);
      auVar81 = vblendps_avx(auVar73,local_7b0,8);
      auVar82 = vandps_avx512vl(auVar81,auVar79);
      auVar81 = vinsertps_avx512f(auVar74,local_360._0_16_,0x30);
      auVar81 = vandps_avx512vl(auVar81,auVar79);
      auVar81 = vmaxps_avx512vl(auVar82,auVar81);
      auVar81 = vmaxps_avx(auVar75,auVar81);
      auVar79 = vmovshdup_avx(auVar81);
      auVar79 = vmaxss_avx(auVar79,auVar81);
      auVar81 = vshufpd_avx(auVar81,auVar81,1);
      auVar81 = vmaxss_avx(auVar81,auVar79);
      auVar94._0_4_ = (float)iVar7;
      local_440._4_12_ = auVar80._4_12_;
      local_440._0_4_ = auVar94._0_4_;
      local_440._16_48_ = auVar135._16_48_;
      auVar94._4_4_ = auVar94._0_4_;
      auVar94._8_4_ = auVar94._0_4_;
      auVar94._12_4_ = auVar94._0_4_;
      auVar94._16_4_ = auVar94._0_4_;
      auVar94._20_4_ = auVar94._0_4_;
      auVar94._24_4_ = auVar94._0_4_;
      auVar94._28_4_ = auVar94._0_4_;
      uVar20 = vcmpps_avx512vl(auVar94,_DAT_02020f40,0xe);
      local_670 = (byte)uVar19 & (byte)uVar20;
      auVar81 = vmulss_avx512f(auVar81,ZEXT416(0x35000000));
      auVar91._8_4_ = 2;
      auVar91._0_8_ = 0x200000002;
      auVar91._12_4_ = 2;
      auVar91._16_4_ = 2;
      auVar91._20_4_ = 2;
      auVar91._24_4_ = 2;
      auVar91._28_4_ = 2;
      local_760 = vpermps_avx512vl(auVar91,ZEXT1632(auVar80));
      auVar135 = ZEXT3264(local_760);
      local_780 = vpermps_avx512vl(auVar91,ZEXT1632(auVar16));
      auVar193 = ZEXT3264(local_780);
      local_3a0 = vpermps_avx512vl(auVar91,ZEXT1632(auVar73));
      local_3c0 = vpermps_avx512vl(auVar91,ZEXT1632(auVar74));
      uVar126 = *(undefined4 *)(ray + k * 4 + 0xc0);
      local_560 = auVar81._0_4_;
      uStack_55c = auVar81._4_4_;
      uStack_558 = auVar81._8_4_;
      uStack_554 = auVar81._12_4_;
      auVar79 = auVar86._0_16_;
      if (local_670 == 0) {
        bVar65 = false;
        auVar81 = vxorps_avx512vl(auVar79,auVar79);
        auVar185 = ZEXT1664(auVar81);
        auVar192 = ZEXT3264(local_7e0);
        auVar187 = ZEXT3264(local_740);
        auVar186 = ZEXT3264(local_800);
        auVar184 = ZEXT3264(local_940);
      }
      else {
        uStack_89c = 0;
        uStack_898 = 0;
        uStack_894 = 0;
        auVar86 = vmulps_avx512vl(local_3c0,auVar86);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_3a0,auVar86);
        auVar85 = vfmadd213ps_avx512vl(auVar85,local_780,auVar96);
        auVar86 = vfmadd213ps_avx512vl(auVar84,local_760,auVar85);
        auVar97 = vmulps_avx512vl(local_3c0,auVar97);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_3a0,auVar97);
        auVar85 = vfmadd213ps_avx512vl(auVar100,local_780,auVar98);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x1210);
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x1694);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x1b18);
        auVar84 = *(undefined1 (*) [32])(bezier_basis0 + lVar53 + 0x1f9c);
        auVar91 = vfmadd213ps_avx512vl(auVar99,local_760,auVar85);
        auVar99 = vmulps_avx512vl(local_860,auVar84);
        auVar85 = vmulps_avx512vl(local_880,auVar84);
        auVar84 = vmulps_avx512vl(local_3c0,auVar84);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_820);
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar97,local_840);
        auVar97 = vfmadd231ps_avx512vl(auVar84,local_3a0,auVar97);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,local_800);
        auVar84 = vfmadd231ps_avx512vl(auVar85,auVar98,local_940);
        auVar85 = vfmadd231ps_avx512vl(auVar97,local_780,auVar98);
        auVar96 = vfmadd231ps_avx512vl(auVar99,auVar100,local_7e0);
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar100,local_740);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x1210);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x1b18);
        auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x1f9c);
        auVar85 = vfmadd231ps_avx512vl(auVar85,local_760,auVar100);
        auVar100 = vmulps_avx512vl(local_860,auVar97);
        auVar95 = vmulps_avx512vl(local_880,auVar97);
        auVar97 = vmulps_avx512vl(local_3c0,auVar97);
        auVar101 = vfmadd231ps_avx512vl(auVar100,auVar98,local_820);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,local_840);
        auVar98 = vfmadd231ps_avx512vl(auVar97,local_3a0,auVar98);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar53 + 0x1694);
        auVar97 = vfmadd231ps_avx512vl(auVar101,auVar100,local_800);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,local_940);
        auVar100 = vfmadd231ps_avx512vl(auVar98,local_780,auVar100);
        auVar98 = vfmadd231ps_avx512vl(auVar97,auVar99,local_7e0);
        auVar97 = vfmadd231ps_avx512vl(auVar95,auVar99,local_740);
        auVar100 = vfmadd231ps_avx512vl(auVar100,local_760,auVar99);
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar96,auVar95);
        vandps_avx512vl(auVar84,auVar95);
        auVar99 = vmaxps_avx(auVar95,auVar95);
        vandps_avx512vl(auVar85,auVar95);
        auVar99 = vmaxps_avx(auVar99,auVar95);
        auVar85 = vbroadcastss_avx512vl(auVar81);
        uVar60 = vcmpps_avx512vl(auVar99,auVar85,1);
        bVar65 = (bool)((byte)uVar60 & 1);
        auVar101._0_4_ = (float)((uint)bVar65 * auVar89._0_4_ | (uint)!bVar65 * auVar96._0_4_);
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar65 * auVar89._4_4_ | (uint)!bVar65 * auVar96._4_4_);
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar65 * auVar89._8_4_ | (uint)!bVar65 * auVar96._8_4_);
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar65 * auVar89._12_4_ | (uint)!bVar65 * auVar96._12_4_);
        bVar65 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar65 * auVar89._16_4_ | (uint)!bVar65 * auVar96._16_4_);
        bVar65 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar65 * auVar89._20_4_ | (uint)!bVar65 * auVar96._20_4_);
        bVar65 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar65 * auVar89._24_4_ | (uint)!bVar65 * auVar96._24_4_);
        bVar65 = SUB81(uVar60 >> 7,0);
        auVar101._28_4_ = (uint)bVar65 * auVar89._28_4_ | (uint)!bVar65 * auVar96._28_4_;
        bVar65 = (bool)((byte)uVar60 & 1);
        auVar108._0_4_ = (float)((uint)bVar65 * auVar90._0_4_ | (uint)!bVar65 * auVar84._0_4_);
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar65 * auVar90._4_4_ | (uint)!bVar65 * auVar84._4_4_);
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar65 * auVar90._8_4_ | (uint)!bVar65 * auVar84._8_4_);
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar65 * auVar90._12_4_ | (uint)!bVar65 * auVar84._12_4_);
        bVar65 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar65 * auVar90._16_4_ | (uint)!bVar65 * auVar84._16_4_);
        bVar65 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar65 * auVar90._20_4_ | (uint)!bVar65 * auVar84._20_4_);
        bVar65 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar65 * auVar90._24_4_ | (uint)!bVar65 * auVar84._24_4_);
        bVar65 = SUB81(uVar60 >> 7,0);
        auVar108._28_4_ = (uint)bVar65 * auVar90._28_4_ | (uint)!bVar65 * auVar84._28_4_;
        vandps_avx512vl(auVar98,auVar95);
        vandps_avx512vl(auVar97,auVar95);
        auVar99 = vmaxps_avx(auVar108,auVar108);
        vandps_avx512vl(auVar100,auVar95);
        auVar99 = vmaxps_avx(auVar99,auVar108);
        uVar60 = vcmpps_avx512vl(auVar99,auVar85,1);
        bVar65 = (bool)((byte)uVar60 & 1);
        auVar95._0_4_ = (float)((uint)bVar65 * auVar89._0_4_ | (uint)!bVar65 * auVar98._0_4_);
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar95._4_4_ = (float)((uint)bVar65 * auVar89._4_4_ | (uint)!bVar65 * auVar98._4_4_);
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar95._8_4_ = (float)((uint)bVar65 * auVar89._8_4_ | (uint)!bVar65 * auVar98._8_4_);
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar95._12_4_ = (float)((uint)bVar65 * auVar89._12_4_ | (uint)!bVar65 * auVar98._12_4_);
        bVar65 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar95._16_4_ = (float)((uint)bVar65 * auVar89._16_4_ | (uint)!bVar65 * auVar98._16_4_);
        bVar65 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar95._20_4_ = (float)((uint)bVar65 * auVar89._20_4_ | (uint)!bVar65 * auVar98._20_4_);
        bVar65 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar95._24_4_ = (float)((uint)bVar65 * auVar89._24_4_ | (uint)!bVar65 * auVar98._24_4_);
        bVar65 = SUB81(uVar60 >> 7,0);
        auVar95._28_4_ = (uint)bVar65 * auVar89._28_4_ | (uint)!bVar65 * auVar98._28_4_;
        bVar65 = (bool)((byte)uVar60 & 1);
        auVar102._0_4_ = (float)((uint)bVar65 * auVar90._0_4_ | (uint)!bVar65 * auVar97._0_4_);
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar65 * auVar90._4_4_ | (uint)!bVar65 * auVar97._4_4_);
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar65 * auVar90._8_4_ | (uint)!bVar65 * auVar97._8_4_);
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar65 * auVar90._12_4_ | (uint)!bVar65 * auVar97._12_4_);
        bVar65 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar65 * auVar90._16_4_ | (uint)!bVar65 * auVar97._16_4_);
        bVar65 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar65 * auVar90._20_4_ | (uint)!bVar65 * auVar97._20_4_);
        bVar65 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar65 * auVar90._24_4_ | (uint)!bVar65 * auVar97._24_4_);
        bVar65 = SUB81(uVar60 >> 7,0);
        auVar102._28_4_ = (uint)bVar65 * auVar90._28_4_ | (uint)!bVar65 * auVar97._28_4_;
        auVar83 = vxorps_avx512vl(auVar79,auVar79);
        auVar185 = ZEXT1664(auVar83);
        auVar99 = vfmadd213ps_avx512vl(auVar101,auVar101,ZEXT1632(auVar83));
        auVar81 = vfmadd231ps_fma(auVar99,auVar108,auVar108);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar84 = vmulps_avx512vl(ZEXT1632(auVar81),auVar97);
        fVar156 = auVar98._0_4_;
        fVar163 = auVar98._4_4_;
        fVar164 = auVar98._8_4_;
        fVar165 = auVar98._12_4_;
        fVar144 = auVar98._16_4_;
        fVar152 = auVar98._20_4_;
        fVar153 = auVar98._24_4_;
        auVar99._4_4_ = fVar163 * fVar163 * fVar163 * auVar84._4_4_;
        auVar99._0_4_ = fVar156 * fVar156 * fVar156 * auVar84._0_4_;
        auVar99._8_4_ = fVar164 * fVar164 * fVar164 * auVar84._8_4_;
        auVar99._12_4_ = fVar165 * fVar165 * fVar165 * auVar84._12_4_;
        auVar99._16_4_ = fVar144 * fVar144 * fVar144 * auVar84._16_4_;
        auVar99._20_4_ = fVar152 * fVar152 * fVar152 * auVar84._20_4_;
        auVar99._24_4_ = fVar153 * fVar153 * fVar153 * auVar84._24_4_;
        auVar99._28_4_ = auVar100._28_4_;
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar85,auVar98);
        auVar100._4_4_ = auVar108._4_4_ * auVar99._4_4_;
        auVar100._0_4_ = auVar108._0_4_ * auVar99._0_4_;
        auVar100._8_4_ = auVar108._8_4_ * auVar99._8_4_;
        auVar100._12_4_ = auVar108._12_4_ * auVar99._12_4_;
        auVar100._16_4_ = auVar108._16_4_ * auVar99._16_4_;
        auVar100._20_4_ = auVar108._20_4_ * auVar99._20_4_;
        auVar100._24_4_ = auVar108._24_4_ * auVar99._24_4_;
        auVar100._28_4_ = auVar84._28_4_;
        auVar98._4_4_ = auVar99._4_4_ * -auVar101._4_4_;
        auVar98._0_4_ = auVar99._0_4_ * -auVar101._0_4_;
        auVar98._8_4_ = auVar99._8_4_ * -auVar101._8_4_;
        auVar98._12_4_ = auVar99._12_4_ * -auVar101._12_4_;
        auVar98._16_4_ = auVar99._16_4_ * -auVar101._16_4_;
        auVar98._20_4_ = auVar99._20_4_ * -auVar101._20_4_;
        auVar98._24_4_ = auVar99._24_4_ * -auVar101._24_4_;
        auVar98._28_4_ = auVar108._28_4_;
        auVar84 = vmulps_avx512vl(auVar99,ZEXT1632(auVar83));
        auVar90 = ZEXT1632(auVar83);
        auVar96 = vfmadd213ps_avx512vl(auVar95,auVar95,auVar90);
        auVar81 = vfmadd231ps_fma(auVar96,auVar102,auVar102);
        auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
        auVar96 = vmulps_avx512vl(ZEXT1632(auVar81),auVar97);
        fVar156 = auVar89._0_4_;
        fVar163 = auVar89._4_4_;
        fVar164 = auVar89._8_4_;
        fVar165 = auVar89._12_4_;
        fVar144 = auVar89._16_4_;
        fVar152 = auVar89._20_4_;
        fVar153 = auVar89._24_4_;
        auVar97._4_4_ = fVar163 * fVar163 * fVar163 * auVar96._4_4_;
        auVar97._0_4_ = fVar156 * fVar156 * fVar156 * auVar96._0_4_;
        auVar97._8_4_ = fVar164 * fVar164 * fVar164 * auVar96._8_4_;
        auVar97._12_4_ = fVar165 * fVar165 * fVar165 * auVar96._12_4_;
        auVar97._16_4_ = fVar144 * fVar144 * fVar144 * auVar96._16_4_;
        auVar97._20_4_ = fVar152 * fVar152 * fVar152 * auVar96._20_4_;
        auVar97._24_4_ = fVar153 * fVar153 * fVar153 * auVar96._24_4_;
        auVar97._28_4_ = auVar99._28_4_;
        auVar99 = vfmadd231ps_avx512vl(auVar97,auVar85,auVar89);
        auVar85._4_4_ = auVar102._4_4_ * auVar99._4_4_;
        auVar85._0_4_ = auVar102._0_4_ * auVar99._0_4_;
        auVar85._8_4_ = auVar102._8_4_ * auVar99._8_4_;
        auVar85._12_4_ = auVar102._12_4_ * auVar99._12_4_;
        auVar85._16_4_ = auVar102._16_4_ * auVar99._16_4_;
        auVar85._20_4_ = auVar102._20_4_ * auVar99._20_4_;
        auVar85._24_4_ = auVar102._24_4_ * auVar99._24_4_;
        auVar85._28_4_ = auVar96._28_4_;
        auVar96._4_4_ = auVar99._4_4_ * -auVar95._4_4_;
        auVar96._0_4_ = auVar99._0_4_ * -auVar95._0_4_;
        auVar96._8_4_ = auVar99._8_4_ * -auVar95._8_4_;
        auVar96._12_4_ = auVar99._12_4_ * -auVar95._12_4_;
        auVar96._16_4_ = auVar99._16_4_ * -auVar95._16_4_;
        auVar96._20_4_ = auVar99._20_4_ * -auVar95._20_4_;
        auVar96._24_4_ = auVar99._24_4_ * -auVar95._24_4_;
        auVar96._28_4_ = auVar89._28_4_;
        auVar99 = vmulps_avx512vl(auVar99,auVar90);
        auVar81 = vfmadd213ps_fma(auVar100,auVar92,ZEXT1632(auVar17));
        auVar79 = vfmadd213ps_fma(auVar98,auVar92,auVar87);
        auVar97 = vfmadd213ps_avx512vl(auVar84,auVar92,auVar91);
        auVar89 = vfmadd213ps_avx512vl(auVar85,auVar93,ZEXT1632(auVar18));
        auVar75 = vfnmadd213ps_fma(auVar100,auVar92,ZEXT1632(auVar17));
        auVar73 = vfmadd213ps_fma(auVar96,auVar93,auVar88);
        auVar82 = vfnmadd213ps_fma(auVar98,auVar92,auVar87);
        auVar80 = vfmadd213ps_fma(auVar99,auVar93,auVar86);
        auVar78 = vfnmadd231ps_fma(auVar91,auVar92,auVar84);
        auVar18 = vfnmadd213ps_fma(auVar85,auVar93,ZEXT1632(auVar18));
        auVar76 = vfnmadd213ps_fma(auVar96,auVar93,auVar88);
        auVar77 = vfnmadd231ps_fma(auVar86,auVar93,auVar99);
        auVar98 = vsubps_avx512vl(auVar89,ZEXT1632(auVar75));
        auVar99 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar82));
        auVar100 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar78));
        auVar86._4_4_ = auVar99._4_4_ * auVar78._4_4_;
        auVar86._0_4_ = auVar99._0_4_ * auVar78._0_4_;
        auVar86._8_4_ = auVar99._8_4_ * auVar78._8_4_;
        auVar86._12_4_ = auVar99._12_4_ * auVar78._12_4_;
        auVar86._16_4_ = auVar99._16_4_ * 0.0;
        auVar86._20_4_ = auVar99._20_4_ * 0.0;
        auVar86._24_4_ = auVar99._24_4_ * 0.0;
        auVar86._28_4_ = auVar84._28_4_;
        auVar16 = vfmsub231ps_fma(auVar86,ZEXT1632(auVar82),auVar100);
        auVar87._4_4_ = auVar100._4_4_ * auVar75._4_4_;
        auVar87._0_4_ = auVar100._0_4_ * auVar75._0_4_;
        auVar87._8_4_ = auVar100._8_4_ * auVar75._8_4_;
        auVar87._12_4_ = auVar100._12_4_ * auVar75._12_4_;
        auVar87._16_4_ = auVar100._16_4_ * 0.0;
        auVar87._20_4_ = auVar100._20_4_ * 0.0;
        auVar87._24_4_ = auVar100._24_4_ * 0.0;
        auVar87._28_4_ = auVar100._28_4_;
        auVar74 = vfmsub231ps_fma(auVar87,ZEXT1632(auVar78),auVar98);
        auVar88._4_4_ = auVar82._4_4_ * auVar98._4_4_;
        auVar88._0_4_ = auVar82._0_4_ * auVar98._0_4_;
        auVar88._8_4_ = auVar82._8_4_ * auVar98._8_4_;
        auVar88._12_4_ = auVar82._12_4_ * auVar98._12_4_;
        auVar88._16_4_ = auVar98._16_4_ * 0.0;
        auVar88._20_4_ = auVar98._20_4_ * 0.0;
        auVar88._24_4_ = auVar98._24_4_ * 0.0;
        auVar88._28_4_ = auVar98._28_4_;
        auVar17 = vfmsub231ps_fma(auVar88,ZEXT1632(auVar75),auVar99);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar17),auVar90,ZEXT1632(auVar74));
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,ZEXT1632(auVar16));
        auVar91 = ZEXT1632(auVar83);
        uVar60 = vcmpps_avx512vl(auVar99,auVar91,2);
        bVar63 = (byte)uVar60;
        fVar71 = (float)((uint)(bVar63 & 1) * auVar81._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar18._0_4_);
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        fVar120 = (float)((uint)bVar65 * auVar81._4_4_ | (uint)!bVar65 * auVar18._4_4_);
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        fVar122 = (float)((uint)bVar65 * auVar81._8_4_ | (uint)!bVar65 * auVar18._8_4_);
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        fVar124 = (float)((uint)bVar65 * auVar81._12_4_ | (uint)!bVar65 * auVar18._12_4_);
        auVar96 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar122,CONCAT44(fVar120,fVar71))));
        fVar72 = (float)((uint)(bVar63 & 1) * auVar79._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar76._0_4_);
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        fVar121 = (float)((uint)bVar65 * auVar79._4_4_ | (uint)!bVar65 * auVar76._4_4_);
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        fVar123 = (float)((uint)bVar65 * auVar79._8_4_ | (uint)!bVar65 * auVar76._8_4_);
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        fVar125 = (float)((uint)bVar65 * auVar79._12_4_ | (uint)!bVar65 * auVar76._12_4_);
        auVar86 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar72))));
        auVar103._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar77._0_4_)
        ;
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar65 * auVar97._4_4_ | (uint)!bVar65 * auVar77._4_4_);
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar65 * auVar97._8_4_ | (uint)!bVar65 * auVar77._8_4_);
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar65 * auVar97._12_4_ | (uint)!bVar65 * auVar77._12_4_);
        fVar163 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar97._16_4_);
        auVar103._16_4_ = fVar163;
        fVar156 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar97._20_4_);
        auVar103._20_4_ = fVar156;
        fVar164 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar97._24_4_);
        auVar103._24_4_ = fVar164;
        iVar1 = (uint)(byte)(uVar60 >> 7) * auVar97._28_4_;
        auVar103._28_4_ = iVar1;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar75),auVar89);
        auVar104._0_4_ =
             (uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar81._0_4_;
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar104._4_4_ = (uint)bVar65 * auVar99._4_4_ | (uint)!bVar65 * auVar81._4_4_;
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar104._8_4_ = (uint)bVar65 * auVar99._8_4_ | (uint)!bVar65 * auVar81._8_4_;
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar104._12_4_ = (uint)bVar65 * auVar99._12_4_ | (uint)!bVar65 * auVar81._12_4_;
        auVar104._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar99._16_4_;
        auVar104._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar99._20_4_;
        auVar104._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar99._24_4_;
        auVar104._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar73));
        auVar105._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar16._0_4_)
        ;
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar65 * auVar99._4_4_ | (uint)!bVar65 * auVar16._4_4_);
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar65 * auVar99._8_4_ | (uint)!bVar65 * auVar16._8_4_);
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar65 * auVar99._12_4_ | (uint)!bVar65 * auVar16._12_4_);
        fVar144 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar99._16_4_);
        auVar105._16_4_ = fVar144;
        fVar152 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar99._20_4_);
        auVar105._20_4_ = fVar152;
        fVar165 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar99._24_4_);
        auVar105._24_4_ = fVar165;
        auVar105._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar99._28_4_;
        auVar99 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar80));
        auVar106._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar79._0_4_)
        ;
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar65 * auVar99._4_4_ | (uint)!bVar65 * auVar79._4_4_);
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar65 * auVar99._8_4_ | (uint)!bVar65 * auVar79._8_4_);
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar65 * auVar99._12_4_ | (uint)!bVar65 * auVar79._12_4_);
        fVar155 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar99._16_4_);
        auVar106._16_4_ = fVar155;
        fVar154 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar99._20_4_);
        auVar106._20_4_ = fVar154;
        fVar153 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar99._24_4_);
        auVar106._24_4_ = fVar153;
        iVar2 = (uint)(byte)(uVar60 >> 7) * auVar99._28_4_;
        auVar106._28_4_ = iVar2;
        auVar107._0_4_ =
             (uint)(bVar63 & 1) * (int)auVar75._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar89._0_4_;
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar65 * (int)auVar75._4_4_ | (uint)!bVar65 * auVar89._4_4_;
        bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar65 * (int)auVar75._8_4_ | (uint)!bVar65 * auVar89._8_4_;
        bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar65 * (int)auVar75._12_4_ | (uint)!bVar65 * auVar89._12_4_;
        auVar107._16_4_ = (uint)!(bool)((byte)(uVar60 >> 4) & 1) * auVar89._16_4_;
        auVar107._20_4_ = (uint)!(bool)((byte)(uVar60 >> 5) & 1) * auVar89._20_4_;
        auVar107._24_4_ = (uint)!(bool)((byte)(uVar60 >> 6) & 1) * auVar89._24_4_;
        auVar107._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar89._28_4_;
        bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar87 = vsubps_avx512vl(auVar107,auVar96);
        auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar13 * (int)auVar82._12_4_ |
                                                 (uint)!bVar13 * auVar73._12_4_,
                                                 CONCAT48((uint)bVar11 * (int)auVar82._8_4_ |
                                                          (uint)!bVar11 * auVar73._8_4_,
                                                          CONCAT44((uint)bVar65 * (int)auVar82._4_4_
                                                                   | (uint)!bVar65 * auVar73._4_4_,
                                                                   (uint)(bVar63 & 1) *
                                                                   (int)auVar82._0_4_ |
                                                                   (uint)!(bool)(bVar63 & 1) *
                                                                   auVar73._0_4_)))),auVar86);
        auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar78._12_4_ |
                                                (uint)!bVar14 * auVar80._12_4_,
                                                CONCAT48((uint)bVar12 * (int)auVar78._8_4_ |
                                                         (uint)!bVar12 * auVar80._8_4_,
                                                         CONCAT44((uint)bVar10 * (int)auVar78._4_4_
                                                                  | (uint)!bVar10 * auVar80._4_4_,
                                                                  (uint)(bVar63 & 1) *
                                                                  (int)auVar78._0_4_ |
                                                                  (uint)!(bool)(bVar63 & 1) *
                                                                  auVar80._0_4_)))),auVar103);
        auVar97 = vsubps_avx(auVar96,auVar104);
        auVar84 = vsubps_avx(auVar86,auVar105);
        auVar85 = vsubps_avx(auVar103,auVar106);
        auVar89._4_4_ = auVar98._4_4_ * fVar120;
        auVar89._0_4_ = auVar98._0_4_ * fVar71;
        auVar89._8_4_ = auVar98._8_4_ * fVar122;
        auVar89._12_4_ = auVar98._12_4_ * fVar124;
        auVar89._16_4_ = auVar98._16_4_ * 0.0;
        auVar89._20_4_ = auVar98._20_4_ * 0.0;
        auVar89._24_4_ = auVar98._24_4_ * 0.0;
        auVar89._28_4_ = 0;
        auVar81 = vfmsub231ps_fma(auVar89,auVar103,auVar87);
        auVar150._0_4_ = fVar72 * auVar87._0_4_;
        auVar150._4_4_ = fVar121 * auVar87._4_4_;
        auVar150._8_4_ = fVar123 * auVar87._8_4_;
        auVar150._12_4_ = fVar125 * auVar87._12_4_;
        auVar150._16_4_ = auVar87._16_4_ * 0.0;
        auVar150._20_4_ = auVar87._20_4_ * 0.0;
        auVar150._24_4_ = auVar87._24_4_ * 0.0;
        auVar150._28_4_ = 0;
        auVar79 = vfmsub231ps_fma(auVar150,auVar96,auVar100);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar91,ZEXT1632(auVar81));
        auVar159._0_4_ = auVar100._0_4_ * auVar103._0_4_;
        auVar159._4_4_ = auVar100._4_4_ * auVar103._4_4_;
        auVar159._8_4_ = auVar100._8_4_ * auVar103._8_4_;
        auVar159._12_4_ = auVar100._12_4_ * auVar103._12_4_;
        auVar159._16_4_ = auVar100._16_4_ * fVar163;
        auVar159._20_4_ = auVar100._20_4_ * fVar156;
        auVar159._24_4_ = auVar100._24_4_ * fVar164;
        auVar159._28_4_ = 0;
        auVar81 = vfmsub231ps_fma(auVar159,auVar86,auVar98);
        auVar88 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar81));
        auVar99 = vmulps_avx512vl(auVar85,auVar104);
        auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar106);
        auVar90._4_4_ = auVar84._4_4_ * auVar106._4_4_;
        auVar90._0_4_ = auVar84._0_4_ * auVar106._0_4_;
        auVar90._8_4_ = auVar84._8_4_ * auVar106._8_4_;
        auVar90._12_4_ = auVar84._12_4_ * auVar106._12_4_;
        auVar90._16_4_ = auVar84._16_4_ * fVar155;
        auVar90._20_4_ = auVar84._20_4_ * fVar154;
        auVar90._24_4_ = auVar84._24_4_ * fVar153;
        auVar90._28_4_ = iVar2;
        auVar81 = vfmsub231ps_fma(auVar90,auVar105,auVar85);
        auVar160._0_4_ = auVar105._0_4_ * auVar97._0_4_;
        auVar160._4_4_ = auVar105._4_4_ * auVar97._4_4_;
        auVar160._8_4_ = auVar105._8_4_ * auVar97._8_4_;
        auVar160._12_4_ = auVar105._12_4_ * auVar97._12_4_;
        auVar160._16_4_ = fVar144 * auVar97._16_4_;
        auVar160._20_4_ = fVar152 * auVar97._20_4_;
        auVar160._24_4_ = fVar165 * auVar97._24_4_;
        auVar160._28_4_ = 0;
        auVar79 = vfmsub231ps_fma(auVar160,auVar84,auVar104);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar91,auVar99);
        auVar89 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar81));
        auVar99 = vmaxps_avx(auVar88,auVar89);
        uVar19 = vcmpps_avx512vl(auVar99,auVar91,2);
        local_670 = local_670 & (byte)uVar19;
        auVar192 = ZEXT3264(local_7e0);
        auVar187 = ZEXT3264(local_740);
        auVar186 = ZEXT3264(local_800);
        auVar184 = ZEXT3264(local_940);
        if (local_670 == 0) {
          local_670 = 0;
        }
        else {
          auVar28._4_4_ = auVar85._4_4_ * auVar100._4_4_;
          auVar28._0_4_ = auVar85._0_4_ * auVar100._0_4_;
          auVar28._8_4_ = auVar85._8_4_ * auVar100._8_4_;
          auVar28._12_4_ = auVar85._12_4_ * auVar100._12_4_;
          auVar28._16_4_ = auVar85._16_4_ * auVar100._16_4_;
          auVar28._20_4_ = auVar85._20_4_ * auVar100._20_4_;
          auVar28._24_4_ = auVar85._24_4_ * auVar100._24_4_;
          auVar28._28_4_ = auVar99._28_4_;
          auVar73 = vfmsub231ps_fma(auVar28,auVar84,auVar98);
          auVar29._4_4_ = auVar98._4_4_ * auVar97._4_4_;
          auVar29._0_4_ = auVar98._0_4_ * auVar97._0_4_;
          auVar29._8_4_ = auVar98._8_4_ * auVar97._8_4_;
          auVar29._12_4_ = auVar98._12_4_ * auVar97._12_4_;
          auVar29._16_4_ = auVar98._16_4_ * auVar97._16_4_;
          auVar29._20_4_ = auVar98._20_4_ * auVar97._20_4_;
          auVar29._24_4_ = auVar98._24_4_ * auVar97._24_4_;
          auVar29._28_4_ = auVar98._28_4_;
          auVar79 = vfmsub231ps_fma(auVar29,auVar87,auVar85);
          auVar30._4_4_ = auVar84._4_4_ * auVar87._4_4_;
          auVar30._0_4_ = auVar84._0_4_ * auVar87._0_4_;
          auVar30._8_4_ = auVar84._8_4_ * auVar87._8_4_;
          auVar30._12_4_ = auVar84._12_4_ * auVar87._12_4_;
          auVar30._16_4_ = auVar84._16_4_ * auVar87._16_4_;
          auVar30._20_4_ = auVar84._20_4_ * auVar87._20_4_;
          auVar30._24_4_ = auVar84._24_4_ * auVar87._24_4_;
          auVar30._28_4_ = auVar84._28_4_;
          auVar80 = vfmsub231ps_fma(auVar30,auVar97,auVar100);
          auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar80));
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar73),auVar91);
          auVar100 = vrcp14ps_avx512vl(auVar99);
          auVar22._8_4_ = 0x3f800000;
          auVar22._0_8_ = &DAT_3f8000003f800000;
          auVar22._12_4_ = 0x3f800000;
          auVar22._16_4_ = 0x3f800000;
          auVar22._20_4_ = 0x3f800000;
          auVar22._24_4_ = 0x3f800000;
          auVar22._28_4_ = 0x3f800000;
          auVar98 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar22);
          auVar81 = vfmadd132ps_fma(auVar98,auVar100,auVar100);
          auVar31._4_4_ = auVar80._4_4_ * auVar103._4_4_;
          auVar31._0_4_ = auVar80._0_4_ * auVar103._0_4_;
          auVar31._8_4_ = auVar80._8_4_ * auVar103._8_4_;
          auVar31._12_4_ = auVar80._12_4_ * auVar103._12_4_;
          auVar31._16_4_ = fVar163 * 0.0;
          auVar31._20_4_ = fVar156 * 0.0;
          auVar31._24_4_ = fVar164 * 0.0;
          auVar31._28_4_ = iVar1;
          auVar79 = vfmadd231ps_fma(auVar31,auVar86,ZEXT1632(auVar79));
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar96,ZEXT1632(auVar73));
          fVar156 = auVar81._0_4_;
          fVar163 = auVar81._4_4_;
          fVar164 = auVar81._8_4_;
          fVar165 = auVar81._12_4_;
          auVar100 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar165,
                                        CONCAT48(auVar79._8_4_ * fVar164,
                                                 CONCAT44(auVar79._4_4_ * fVar163,
                                                          auVar79._0_4_ * fVar156))));
          auVar175._4_4_ = uVar126;
          auVar175._0_4_ = uVar126;
          auVar175._8_4_ = uVar126;
          auVar175._12_4_ = uVar126;
          auVar175._16_4_ = uVar126;
          auVar175._20_4_ = uVar126;
          auVar175._24_4_ = uVar126;
          auVar175._28_4_ = uVar126;
          uVar19 = vcmpps_avx512vl(auVar175,auVar100,2);
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar23._4_4_ = uVar3;
          auVar23._0_4_ = uVar3;
          auVar23._8_4_ = uVar3;
          auVar23._12_4_ = uVar3;
          auVar23._16_4_ = uVar3;
          auVar23._20_4_ = uVar3;
          auVar23._24_4_ = uVar3;
          auVar23._28_4_ = uVar3;
          uVar20 = vcmpps_avx512vl(auVar100,auVar23,2);
          local_670 = (byte)uVar19 & (byte)uVar20 & local_670;
          if (local_670 != 0) {
            uVar19 = vcmpps_avx512vl(auVar99,auVar91,4);
            if ((local_670 & (byte)uVar19) != 0) {
              local_670 = local_670 & (byte)uVar19;
              fVar144 = auVar88._0_4_ * fVar156;
              fVar152 = auVar88._4_4_ * fVar163;
              auVar32._4_4_ = fVar152;
              auVar32._0_4_ = fVar144;
              fVar153 = auVar88._8_4_ * fVar164;
              auVar32._8_4_ = fVar153;
              fVar154 = auVar88._12_4_ * fVar165;
              auVar32._12_4_ = fVar154;
              fVar155 = auVar88._16_4_ * 0.0;
              auVar32._16_4_ = fVar155;
              fVar71 = auVar88._20_4_ * 0.0;
              auVar32._20_4_ = fVar71;
              fVar72 = auVar88._24_4_ * 0.0;
              auVar32._24_4_ = fVar72;
              auVar32._28_4_ = auVar88._28_4_;
              fVar156 = auVar89._0_4_ * fVar156;
              fVar163 = auVar89._4_4_ * fVar163;
              auVar33._4_4_ = fVar163;
              auVar33._0_4_ = fVar156;
              fVar164 = auVar89._8_4_ * fVar164;
              auVar33._8_4_ = fVar164;
              fVar165 = auVar89._12_4_ * fVar165;
              auVar33._12_4_ = fVar165;
              fVar120 = auVar89._16_4_ * 0.0;
              auVar33._16_4_ = fVar120;
              fVar121 = auVar89._20_4_ * 0.0;
              auVar33._20_4_ = fVar121;
              fVar122 = auVar89._24_4_ * 0.0;
              auVar33._24_4_ = fVar122;
              auVar33._28_4_ = auVar89._28_4_;
              auVar169._8_4_ = 0x3f800000;
              auVar169._0_8_ = &DAT_3f8000003f800000;
              auVar169._12_4_ = 0x3f800000;
              auVar169._16_4_ = 0x3f800000;
              auVar169._20_4_ = 0x3f800000;
              auVar169._24_4_ = 0x3f800000;
              auVar169._28_4_ = 0x3f800000;
              auVar99 = vsubps_avx(auVar169,auVar32);
              local_960._0_4_ =
                   (uint)(bVar63 & 1) * (int)fVar144 | (uint)!(bool)(bVar63 & 1) * auVar99._0_4_;
              bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
              local_960._4_4_ = (uint)bVar65 * (int)fVar152 | (uint)!bVar65 * auVar99._4_4_;
              bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
              local_960._8_4_ = (uint)bVar65 * (int)fVar153 | (uint)!bVar65 * auVar99._8_4_;
              bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
              local_960._12_4_ = (uint)bVar65 * (int)fVar154 | (uint)!bVar65 * auVar99._12_4_;
              bVar65 = (bool)((byte)(uVar60 >> 4) & 1);
              local_960._16_4_ = (uint)bVar65 * (int)fVar155 | (uint)!bVar65 * auVar99._16_4_;
              bVar65 = (bool)((byte)(uVar60 >> 5) & 1);
              local_960._20_4_ = (uint)bVar65 * (int)fVar71 | (uint)!bVar65 * auVar99._20_4_;
              bVar65 = (bool)((byte)(uVar60 >> 6) & 1);
              local_960._24_4_ = (uint)bVar65 * (int)fVar72 | (uint)!bVar65 * auVar99._24_4_;
              bVar65 = SUB81(uVar60 >> 7,0);
              local_960._28_4_ = (uint)bVar65 * auVar88._28_4_ | (uint)!bVar65 * auVar99._28_4_;
              auVar99 = vsubps_avx(auVar169,auVar33);
              local_540._0_4_ =
                   (uint)(bVar63 & 1) * (int)fVar156 | (uint)!(bool)(bVar63 & 1) * auVar99._0_4_;
              bVar65 = (bool)((byte)(uVar60 >> 1) & 1);
              local_540._4_4_ = (uint)bVar65 * (int)fVar163 | (uint)!bVar65 * auVar99._4_4_;
              bVar65 = (bool)((byte)(uVar60 >> 2) & 1);
              local_540._8_4_ = (uint)bVar65 * (int)fVar164 | (uint)!bVar65 * auVar99._8_4_;
              bVar65 = (bool)((byte)(uVar60 >> 3) & 1);
              local_540._12_4_ = (uint)bVar65 * (int)fVar165 | (uint)!bVar65 * auVar99._12_4_;
              bVar65 = (bool)((byte)(uVar60 >> 4) & 1);
              local_540._16_4_ = (uint)bVar65 * (int)fVar120 | (uint)!bVar65 * auVar99._16_4_;
              bVar65 = (bool)((byte)(uVar60 >> 5) & 1);
              local_540._20_4_ = (uint)bVar65 * (int)fVar121 | (uint)!bVar65 * auVar99._20_4_;
              bVar65 = (bool)((byte)(uVar60 >> 6) & 1);
              local_540._24_4_ = (uint)bVar65 * (int)fVar122 | (uint)!bVar65 * auVar99._24_4_;
              bVar65 = SUB81(uVar60 >> 7,0);
              local_540._28_4_ = (uint)bVar65 * auVar89._28_4_ | (uint)!bVar65 * auVar99._28_4_;
              local_980 = auVar100;
              goto LAB_01b35954;
            }
          }
          local_670 = 0;
        }
LAB_01b35954:
        auVar191 = ZEXT3264(local_880);
        auVar190 = ZEXT3264(local_860);
        auVar189 = ZEXT3264(local_840);
        auVar188 = ZEXT3264(local_820);
        auVar193 = ZEXT3264(local_780);
        auVar135 = ZEXT3264(local_760);
        if (local_670 != 0) {
          auVar99 = vsubps_avx(auVar93,auVar92);
          auVar81 = vfmadd213ps_fma(auVar99,local_960,auVar92);
          uVar3 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar92._4_4_ = uVar3;
          auVar92._0_4_ = uVar3;
          auVar92._8_4_ = uVar3;
          auVar92._12_4_ = uVar3;
          auVar92._16_4_ = uVar3;
          auVar92._20_4_ = uVar3;
          auVar92._24_4_ = uVar3;
          auVar92._28_4_ = uVar3;
          auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                       CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                CONCAT44(auVar81._4_4_ +
                                                                         auVar81._4_4_,
                                                                         auVar81._0_4_ +
                                                                         auVar81._0_4_)))),auVar92);
          uVar19 = vcmpps_avx512vl(local_980,auVar99,6);
          local_670 = local_670 & (byte)uVar19;
          if (local_670 != 0) {
            auVar133._8_4_ = 0xbf800000;
            auVar133._0_8_ = 0xbf800000bf800000;
            auVar133._12_4_ = 0xbf800000;
            auVar133._16_4_ = 0xbf800000;
            auVar133._20_4_ = 0xbf800000;
            auVar133._24_4_ = 0xbf800000;
            auVar133._28_4_ = 0xbf800000;
            auVar93._8_4_ = 0x40000000;
            auVar93._0_8_ = 0x4000000040000000;
            auVar93._12_4_ = 0x40000000;
            auVar93._16_4_ = 0x40000000;
            auVar93._20_4_ = 0x40000000;
            auVar93._24_4_ = 0x40000000;
            auVar93._28_4_ = 0x40000000;
            local_700 = vfmadd132ps_avx512vl(local_540,auVar133,auVar93);
            local_540 = local_700;
            auVar99 = local_540;
            local_6c0 = 0;
            local_6b0 = local_990._0_8_;
            uStack_6a8 = local_990._8_8_;
            local_6a0 = local_790._0_8_;
            uStack_698 = local_790._8_8_;
            local_690 = local_7b0._0_8_;
            uStack_688 = local_7b0._8_8_;
            local_680 = local_7a0._0_8_;
            uStack_678 = local_7a0._8_8_;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar65 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar156 = 1.0 / auVar94._0_4_;
                local_660[0] = fVar156 * (local_960._0_4_ + 0.0);
                local_660[1] = fVar156 * (local_960._4_4_ + 1.0);
                local_660[2] = fVar156 * (local_960._8_4_ + 2.0);
                local_660[3] = fVar156 * (local_960._12_4_ + 3.0);
                fStack_650 = fVar156 * (local_960._16_4_ + 4.0);
                fStack_64c = fVar156 * (local_960._20_4_ + 5.0);
                fStack_648 = fVar156 * (local_960._24_4_ + 6.0);
                fStack_644 = local_960._28_4_ + 7.0;
                local_540._0_8_ = local_700._0_8_;
                local_540._8_8_ = local_700._8_8_;
                local_540._16_8_ = local_700._16_8_;
                local_540._24_8_ = local_700._24_8_;
                local_640 = local_540._0_8_;
                uStack_638 = local_540._8_8_;
                uStack_630 = local_540._16_8_;
                uStack_628 = local_540._24_8_;
                local_620 = local_980;
                uVar60 = 0;
                uVar67 = (ulong)local_670;
                for (uVar66 = uVar67; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000)
                {
                  uVar60 = uVar60 + 1;
                }
                auVar118 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar118);
                local_9a0 = local_790._0_4_;
                uStack_99c = local_790._4_4_;
                uStack_998 = local_790._8_8_;
                auVar118 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar118);
                local_900 = local_7b0._0_8_;
                uStack_8f8 = local_7b0._8_8_;
                local_910 = local_7a0._0_4_;
                fStack_90c = local_7a0._4_4_;
                fStack_908 = local_7a0._8_4_;
                fStack_904 = local_7a0._12_4_;
                bVar65 = true;
                local_8a0 = uVar126;
                local_720 = local_960;
                local_6e0 = local_980;
                local_6bc = iVar7;
                local_540 = auVar99;
                do {
                  auVar73 = auVar185._0_16_;
                  local_480._0_8_ = uVar67;
                  uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar60]));
                  local_5a0 = uVar60;
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_640 + uVar60 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar60 * 4);
                  local_9d0.context = context->user;
                  fVar165 = local_200._0_4_;
                  fVar163 = 1.0 - fVar165;
                  fVar156 = fVar163 * fVar163 * -3.0;
                  auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * fVar163)),
                                            ZEXT416((uint)(fVar165 * fVar163)),ZEXT416(0xc0000000));
                  auVar79 = vfmsub132ss_fma(ZEXT416((uint)(fVar165 * fVar163)),
                                            ZEXT416((uint)(fVar165 * fVar165)),ZEXT416(0x40000000));
                  fVar163 = auVar81._0_4_ * 3.0;
                  fVar164 = auVar79._0_4_ * 3.0;
                  fVar165 = fVar165 * fVar165 * 3.0;
                  auVar167._0_4_ = fVar165 * local_910;
                  auVar167._4_4_ = fVar165 * fStack_90c;
                  auVar167._8_4_ = fVar165 * fStack_908;
                  auVar167._12_4_ = fVar165 * fStack_904;
                  auVar129._4_4_ = fVar164;
                  auVar129._0_4_ = fVar164;
                  auVar129._8_4_ = fVar164;
                  auVar129._12_4_ = fVar164;
                  auVar56._8_8_ = uStack_8f8;
                  auVar56._0_8_ = local_900;
                  auVar81 = vfmadd132ps_fma(auVar129,auVar167,auVar56);
                  auVar148._4_4_ = fVar163;
                  auVar148._0_4_ = fVar163;
                  auVar148._8_4_ = fVar163;
                  auVar148._12_4_ = fVar163;
                  auVar54._4_4_ = uStack_99c;
                  auVar54._0_4_ = local_9a0;
                  auVar54._8_8_ = uStack_998;
                  auVar81 = vfmadd132ps_fma(auVar148,auVar81,auVar54);
                  auVar130._4_4_ = fVar156;
                  auVar130._0_4_ = fVar156;
                  auVar130._8_4_ = fVar156;
                  auVar130._12_4_ = fVar156;
                  auVar81 = vfmadd132ps_fma(auVar130,auVar81,local_990);
                  auVar118 = vbroadcastss_avx512f(auVar81);
                  auVar119 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar119,ZEXT1664(auVar81));
                  auVar119 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar119,ZEXT1664(auVar81));
                  local_2c0[0] = (RTCHitN)auVar118[0];
                  local_2c0[1] = (RTCHitN)auVar118[1];
                  local_2c0[2] = (RTCHitN)auVar118[2];
                  local_2c0[3] = (RTCHitN)auVar118[3];
                  local_2c0[4] = (RTCHitN)auVar118[4];
                  local_2c0[5] = (RTCHitN)auVar118[5];
                  local_2c0[6] = (RTCHitN)auVar118[6];
                  local_2c0[7] = (RTCHitN)auVar118[7];
                  local_2c0[8] = (RTCHitN)auVar118[8];
                  local_2c0[9] = (RTCHitN)auVar118[9];
                  local_2c0[10] = (RTCHitN)auVar118[10];
                  local_2c0[0xb] = (RTCHitN)auVar118[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar118[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar118[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar118[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar118[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar118[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar118[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar118[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar118[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar118[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar118[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar118[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar118[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar118[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar118[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar118[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar118[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar118[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar118[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar118[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar118[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar118[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar118[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar118[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar118[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar118[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar118[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar118[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar118[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar118[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar118[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar118[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar118[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar118[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar118[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar118[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar118[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar118[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar118[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar118[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar118[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar118[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar118[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar118[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar118[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar118[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar118[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar118[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar118[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar118[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar118[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar118[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar118[0x3f];
                  local_180 = local_500._0_8_;
                  uStack_178 = local_500._8_8_;
                  uStack_170 = local_500._16_8_;
                  uStack_168 = local_500._24_8_;
                  uStack_160 = local_500._32_8_;
                  uStack_158 = local_500._40_8_;
                  uStack_150 = local_500._48_8_;
                  uStack_148 = local_500._56_8_;
                  auVar118 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar118);
                  vpcmpeqd_avx2(auVar118._0_32_,auVar118._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_9d0.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_9d0.context)->instPrimID[0]));
                  local_600 = local_300;
                  local_9d0.valid = (int *)local_600;
                  local_9d0.geometryUserPtr = pGVar8->userPtr;
                  local_9d0.hit = local_2c0;
                  local_9d0.N = 0x10;
                  local_9d0.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_9d0);
                    auVar193 = ZEXT3264(local_780);
                    auVar135 = ZEXT3264(local_760);
                    auVar191 = ZEXT3264(local_880);
                    auVar190 = ZEXT3264(local_860);
                    auVar189 = ZEXT3264(local_840);
                    auVar188 = ZEXT3264(local_820);
                    auVar184 = ZEXT3264(local_940);
                    auVar186 = ZEXT3264(local_800);
                    auVar187 = ZEXT3264(local_740);
                    auVar192 = ZEXT3264(local_7e0);
                    auVar81 = vxorps_avx512vl(auVar73,auVar73);
                    auVar185 = ZEXT1664(auVar81);
                    uVar126 = local_8a0;
                  }
                  auVar81 = auVar185._0_16_;
                  auVar118 = vmovdqa64_avx512f(local_600);
                  uVar19 = vptestmd_avx512f(auVar118,auVar118);
                  if ((short)uVar19 == 0) {
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_9d0);
                      auVar193 = ZEXT3264(local_780);
                      auVar135 = ZEXT3264(local_760);
                      auVar191 = ZEXT3264(local_880);
                      auVar190 = ZEXT3264(local_860);
                      auVar189 = ZEXT3264(local_840);
                      auVar188 = ZEXT3264(local_820);
                      auVar184 = ZEXT3264(local_940);
                      auVar186 = ZEXT3264(local_800);
                      auVar187 = ZEXT3264(local_740);
                      auVar192 = ZEXT3264(local_7e0);
                      auVar81 = vxorps_avx512vl(auVar81,auVar81);
                      auVar185 = ZEXT1664(auVar81);
                      uVar126 = local_8a0;
                    }
                    auVar118 = vmovdqa64_avx512f(local_600);
                    uVar60 = vptestmd_avx512f(auVar118,auVar118);
                    auVar119 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar10 = (bool)((byte)uVar60 & 1);
                    auVar118._0_4_ =
                         (uint)bVar10 * auVar119._0_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x200);
                    bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
                    auVar118._4_4_ =
                         (uint)bVar10 * auVar119._4_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x204);
                    bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
                    auVar118._8_4_ =
                         (uint)bVar10 * auVar119._8_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x208);
                    bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
                    auVar118._12_4_ =
                         (uint)bVar10 * auVar119._12_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x20c);
                    bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
                    auVar118._16_4_ =
                         (uint)bVar10 * auVar119._16_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x210);
                    bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
                    auVar118._20_4_ =
                         (uint)bVar10 * auVar119._20_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x214);
                    bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
                    auVar118._24_4_ =
                         (uint)bVar10 * auVar119._24_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x218);
                    bVar10 = (bool)((byte)(uVar60 >> 7) & 1);
                    auVar118._28_4_ =
                         (uint)bVar10 * auVar119._28_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x21c);
                    bVar10 = (bool)((byte)(uVar60 >> 8) & 1);
                    auVar118._32_4_ =
                         (uint)bVar10 * auVar119._32_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x220);
                    bVar10 = (bool)((byte)(uVar60 >> 9) & 1);
                    auVar118._36_4_ =
                         (uint)bVar10 * auVar119._36_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x224);
                    bVar10 = (bool)((byte)(uVar60 >> 10) & 1);
                    auVar118._40_4_ =
                         (uint)bVar10 * auVar119._40_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x228);
                    bVar10 = (bool)((byte)(uVar60 >> 0xb) & 1);
                    auVar118._44_4_ =
                         (uint)bVar10 * auVar119._44_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x22c);
                    bVar10 = (bool)((byte)(uVar60 >> 0xc) & 1);
                    auVar118._48_4_ =
                         (uint)bVar10 * auVar119._48_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x230);
                    bVar10 = (bool)((byte)(uVar60 >> 0xd) & 1);
                    auVar118._52_4_ =
                         (uint)bVar10 * auVar119._52_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x234);
                    bVar10 = (bool)((byte)(uVar60 >> 0xe) & 1);
                    auVar118._56_4_ =
                         (uint)bVar10 * auVar119._56_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x238);
                    bVar10 = SUB81(uVar60 >> 0xf,0);
                    auVar118._60_4_ =
                         (uint)bVar10 * auVar119._60_4_ |
                         (uint)!bVar10 * *(int *)(local_9d0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_9d0.ray + 0x200) = auVar118;
                    if ((short)uVar60 != 0) break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
                  uVar60 = 0;
                  uVar67 = local_480._0_8_ ^ 1L << (local_5a0 & 0x3f);
                  for (uVar66 = uVar67; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000
                      ) {
                    uVar60 = uVar60 + 1;
                  }
                  bVar65 = uVar67 != 0;
                } while (bVar65);
              }
              goto LAB_01b35f58;
            }
          }
        }
        bVar65 = false;
      }
LAB_01b35f58:
      if (8 < iVar7) {
        auVar99 = vpbroadcastd_avx512vl();
        auVar119 = ZEXT3264(auVar99);
        local_8a0 = local_560;
        uStack_89c = local_560;
        uStack_898 = local_560;
        uStack_894 = local_560;
        uStack_890 = local_560;
        uStack_88c = local_560;
        uStack_888 = local_560;
        uStack_884 = local_560;
        local_560 = uVar126;
        uStack_55c = uVar126;
        uStack_558 = uVar126;
        uStack_554 = uVar126;
        uStack_550 = uVar126;
        uStack_54c = uVar126;
        uStack_548 = uVar126;
        uStack_544 = uVar126;
        local_5a0._0_4_ = 1.0 / (float)local_440._0_4_;
        local_5a0._4_4_ = (float)local_5a0;
        fStack_598 = (float)local_5a0;
        fStack_594 = (float)local_5a0;
        fStack_590 = (float)local_5a0;
        fStack_58c = (float)local_5a0;
        fStack_588 = (float)local_5a0;
        fStack_584 = (float)local_5a0;
        auVar118 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar118);
        auVar118 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar118);
        lVar69 = 8;
        do {
          auVar99 = vpbroadcastd_avx512vl();
          auVar84 = vpor_avx2(auVar99,_DAT_0205a920);
          uVar20 = vpcmpgtd_avx512vl(auVar119._0_32_,auVar84);
          auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 * 4 + lVar53);
          auVar100 = *(undefined1 (*) [32])(lVar53 + 0x2227768 + lVar69 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar53 + 0x2227bec + lVar69 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar53 + 0x2228070 + lVar69 * 4);
          local_860 = auVar190._0_32_;
          auVar85 = vmulps_avx512vl(local_860,auVar97);
          local_880 = auVar191._0_32_;
          auVar96 = vmulps_avx512vl(local_880,auVar97);
          auVar34._4_4_ = auVar97._4_4_ * (float)local_360._4_4_;
          auVar34._0_4_ = auVar97._0_4_ * (float)local_360._0_4_;
          auVar34._8_4_ = auVar97._8_4_ * fStack_358;
          auVar34._12_4_ = auVar97._12_4_ * fStack_354;
          auVar34._16_4_ = auVar97._16_4_ * fStack_350;
          auVar34._20_4_ = auVar97._20_4_ * fStack_34c;
          auVar34._24_4_ = auVar97._24_4_ * fStack_348;
          auVar34._28_4_ = auVar84._28_4_;
          local_820 = auVar188._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar85,auVar98,local_820);
          local_840 = auVar189._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar96,auVar98,local_840);
          auVar81 = vfmadd231ps_fma(auVar34,auVar98,local_340);
          auVar103 = auVar186._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar100,auVar103);
          auVar102 = auVar184._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,auVar102);
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar100,local_320);
          auVar104 = auVar192._0_32_;
          auVar89 = vfmadd231ps_avx512vl(auVar84,auVar99,auVar104);
          local_740 = auVar187._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar85,auVar99,local_740);
          auVar84 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 * 4 + lVar53);
          auVar85 = *(undefined1 (*) [32])(lVar53 + 0x2229b88 + lVar69 * 4);
          auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar99,local_380);
          auVar96 = *(undefined1 (*) [32])(lVar53 + 0x222a00c + lVar69 * 4);
          auVar86 = *(undefined1 (*) [32])(lVar53 + 0x222a490 + lVar69 * 4);
          auVar87 = vmulps_avx512vl(local_860,auVar86);
          auVar88 = vmulps_avx512vl(local_880,auVar86);
          auVar35._4_4_ = auVar86._4_4_ * (float)local_360._4_4_;
          auVar35._0_4_ = auVar86._0_4_ * (float)local_360._0_4_;
          auVar35._8_4_ = auVar86._8_4_ * fStack_358;
          auVar35._12_4_ = auVar86._12_4_ * fStack_354;
          auVar35._16_4_ = auVar86._16_4_ * fStack_350;
          auVar35._20_4_ = auVar86._20_4_ * fStack_34c;
          auVar35._24_4_ = auVar86._24_4_ * fStack_348;
          auVar35._28_4_ = uStack_344;
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar96,local_820);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar96,local_840);
          auVar81 = vfmadd231ps_fma(auVar35,auVar96,local_340);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar103);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar85,auVar102);
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar85,local_320);
          auVar92 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar104);
          auVar93 = vfmadd231ps_avx512vl(auVar88,auVar84,local_740);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar84,local_380);
          auVar95 = vmaxps_avx512vl(auVar91,auVar94);
          auVar87 = vsubps_avx(auVar92,auVar89);
          auVar88 = vsubps_avx(auVar93,auVar90);
          auVar101 = vmulps_avx512vl(auVar90,auVar87);
          auVar108 = vmulps_avx512vl(auVar89,auVar88);
          auVar101 = vsubps_avx512vl(auVar101,auVar108);
          auVar108 = vmulps_avx512vl(auVar88,auVar88);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar87,auVar87);
          auVar95 = vmulps_avx512vl(auVar95,auVar95);
          auVar95 = vmulps_avx512vl(auVar95,auVar108);
          auVar101 = vmulps_avx512vl(auVar101,auVar101);
          uVar19 = vcmpps_avx512vl(auVar101,auVar95,2);
          local_670 = (byte)uVar20 & (byte)uVar19;
          if (local_670 == 0) {
            auVar184 = ZEXT3264(auVar102);
          }
          else {
            auVar86 = vmulps_avx512vl(local_3c0,auVar86);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_3a0,auVar86);
            local_780 = auVar193._0_32_;
            auVar85 = vfmadd213ps_avx512vl(auVar85,local_780,auVar96);
            local_760 = auVar135._0_32_;
            auVar84 = vfmadd213ps_avx512vl(auVar84,local_760,auVar85);
            auVar97 = vmulps_avx512vl(local_3c0,auVar97);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_3a0,auVar97);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_780,auVar98);
            auVar85 = vfmadd213ps_avx512vl(auVar99,local_760,auVar100);
            auVar99 = *(undefined1 (*) [32])(lVar53 + 0x22284f4 + lVar69 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar53 + 0x2228978 + lVar69 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar53 + 0x2228dfc + lVar69 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar53 + 0x2229280 + lVar69 * 4);
            auVar96 = vmulps_avx512vl(local_860,auVar97);
            auVar86 = vmulps_avx512vl(local_880,auVar97);
            auVar97 = vmulps_avx512vl(local_3c0,auVar97);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,local_820);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar98,local_840);
            auVar98 = vfmadd231ps_avx512vl(auVar97,local_3a0,auVar98);
            auVar97 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar103);
            auVar96 = vfmadd231ps_avx512vl(auVar86,auVar100,auVar102);
            auVar100 = vfmadd231ps_avx512vl(auVar98,local_780,auVar100);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar104);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_740);
            auVar86 = vfmadd231ps_avx512vl(auVar100,local_760,auVar99);
            auVar99 = *(undefined1 (*) [32])(lVar53 + 0x222a914 + lVar69 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar53 + 0x222b21c + lVar69 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar53 + 0x222b6a0 + lVar69 * 4);
            auVar95 = vmulps_avx512vl(local_860,auVar98);
            auVar101 = vmulps_avx512vl(local_880,auVar98);
            auVar98 = vmulps_avx512vl(local_3c0,auVar98);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,local_820);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,local_840);
            auVar98 = vfmadd231ps_avx512vl(auVar98,local_3a0,auVar100);
            auVar100 = *(undefined1 (*) [32])(lVar53 + 0x222ad98 + lVar69 * 4);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar103);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar102);
            auVar100 = vfmadd231ps_avx512vl(auVar98,local_780,auVar100);
            auVar98 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar104);
            auVar95 = vfmadd231ps_avx512vl(auVar101,auVar99,local_740);
            auVar100 = vfmadd231ps_avx512vl(auVar100,local_760,auVar99);
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar97,auVar101);
            vandps_avx512vl(auVar96,auVar101);
            auVar99 = vmaxps_avx(auVar101,auVar101);
            vandps_avx512vl(auVar86,auVar101);
            auVar99 = vmaxps_avx(auVar99,auVar101);
            auVar58._4_4_ = uStack_89c;
            auVar58._0_4_ = local_8a0;
            auVar58._8_4_ = uStack_898;
            auVar58._12_4_ = uStack_894;
            auVar58._16_4_ = uStack_890;
            auVar58._20_4_ = uStack_88c;
            auVar58._24_4_ = uStack_888;
            auVar58._28_4_ = uStack_884;
            uVar60 = vcmpps_avx512vl(auVar99,auVar58,1);
            bVar10 = (bool)((byte)uVar60 & 1);
            auVar109._0_4_ = (float)((uint)bVar10 * auVar87._0_4_ | (uint)!bVar10 * auVar97._0_4_);
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar10 * auVar87._4_4_ | (uint)!bVar10 * auVar97._4_4_);
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar10 * auVar87._8_4_ | (uint)!bVar10 * auVar97._8_4_);
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar10 * auVar87._12_4_ | (uint)!bVar10 * auVar97._12_4_);
            bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar109._16_4_ =
                 (float)((uint)bVar10 * auVar87._16_4_ | (uint)!bVar10 * auVar97._16_4_);
            bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar109._20_4_ =
                 (float)((uint)bVar10 * auVar87._20_4_ | (uint)!bVar10 * auVar97._20_4_);
            bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar109._24_4_ =
                 (float)((uint)bVar10 * auVar87._24_4_ | (uint)!bVar10 * auVar97._24_4_);
            bVar10 = SUB81(uVar60 >> 7,0);
            auVar109._28_4_ = (uint)bVar10 * auVar87._28_4_ | (uint)!bVar10 * auVar97._28_4_;
            bVar10 = (bool)((byte)uVar60 & 1);
            auVar110._0_4_ = (float)((uint)bVar10 * auVar88._0_4_ | (uint)!bVar10 * auVar96._0_4_);
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar10 * auVar88._4_4_ | (uint)!bVar10 * auVar96._4_4_);
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar10 * auVar88._8_4_ | (uint)!bVar10 * auVar96._8_4_);
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar10 * auVar88._12_4_ | (uint)!bVar10 * auVar96._12_4_);
            bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar110._16_4_ =
                 (float)((uint)bVar10 * auVar88._16_4_ | (uint)!bVar10 * auVar96._16_4_);
            bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar110._20_4_ =
                 (float)((uint)bVar10 * auVar88._20_4_ | (uint)!bVar10 * auVar96._20_4_);
            bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar110._24_4_ =
                 (float)((uint)bVar10 * auVar88._24_4_ | (uint)!bVar10 * auVar96._24_4_);
            bVar10 = SUB81(uVar60 >> 7,0);
            auVar110._28_4_ = (uint)bVar10 * auVar88._28_4_ | (uint)!bVar10 * auVar96._28_4_;
            vandps_avx512vl(auVar98,auVar101);
            vandps_avx512vl(auVar95,auVar101);
            auVar99 = vmaxps_avx(auVar110,auVar110);
            vandps_avx512vl(auVar100,auVar101);
            auVar99 = vmaxps_avx(auVar99,auVar110);
            uVar60 = vcmpps_avx512vl(auVar99,auVar58,1);
            bVar10 = (bool)((byte)uVar60 & 1);
            auVar111._0_4_ = (uint)bVar10 * auVar87._0_4_ | (uint)!bVar10 * auVar98._0_4_;
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar111._4_4_ = (uint)bVar10 * auVar87._4_4_ | (uint)!bVar10 * auVar98._4_4_;
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar111._8_4_ = (uint)bVar10 * auVar87._8_4_ | (uint)!bVar10 * auVar98._8_4_;
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar111._12_4_ = (uint)bVar10 * auVar87._12_4_ | (uint)!bVar10 * auVar98._12_4_;
            bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar111._16_4_ = (uint)bVar10 * auVar87._16_4_ | (uint)!bVar10 * auVar98._16_4_;
            bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar111._20_4_ = (uint)bVar10 * auVar87._20_4_ | (uint)!bVar10 * auVar98._20_4_;
            bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar111._24_4_ = (uint)bVar10 * auVar87._24_4_ | (uint)!bVar10 * auVar98._24_4_;
            bVar10 = SUB81(uVar60 >> 7,0);
            auVar111._28_4_ = (uint)bVar10 * auVar87._28_4_ | (uint)!bVar10 * auVar98._28_4_;
            bVar10 = (bool)((byte)uVar60 & 1);
            auVar112._0_4_ = (float)((uint)bVar10 * auVar88._0_4_ | (uint)!bVar10 * auVar95._0_4_);
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar10 * auVar88._4_4_ | (uint)!bVar10 * auVar95._4_4_);
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar10 * auVar88._8_4_ | (uint)!bVar10 * auVar95._8_4_);
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar10 * auVar88._12_4_ | (uint)!bVar10 * auVar95._12_4_);
            bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar112._16_4_ =
                 (float)((uint)bVar10 * auVar88._16_4_ | (uint)!bVar10 * auVar95._16_4_);
            bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar112._20_4_ =
                 (float)((uint)bVar10 * auVar88._20_4_ | (uint)!bVar10 * auVar95._20_4_);
            bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar112._24_4_ =
                 (float)((uint)bVar10 * auVar88._24_4_ | (uint)!bVar10 * auVar95._24_4_);
            bVar10 = SUB81(uVar60 >> 7,0);
            auVar112._28_4_ = (uint)bVar10 * auVar88._28_4_ | (uint)!bVar10 * auVar95._28_4_;
            auVar176._8_4_ = 0x80000000;
            auVar176._0_8_ = 0x8000000080000000;
            auVar176._12_4_ = 0x80000000;
            auVar176._16_4_ = 0x80000000;
            auVar176._20_4_ = 0x80000000;
            auVar176._24_4_ = 0x80000000;
            auVar176._28_4_ = 0x80000000;
            auVar99 = vxorps_avx512vl(auVar111,auVar176);
            auVar95 = auVar185._0_32_;
            auVar100 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar95);
            auVar81 = vfmadd231ps_fma(auVar100,auVar110,auVar110);
            auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
            auVar183._8_4_ = 0xbf000000;
            auVar183._0_8_ = 0xbf000000bf000000;
            auVar183._12_4_ = 0xbf000000;
            auVar183._16_4_ = 0xbf000000;
            auVar183._20_4_ = 0xbf000000;
            auVar183._24_4_ = 0xbf000000;
            auVar183._28_4_ = 0xbf000000;
            fVar156 = auVar100._0_4_;
            fVar163 = auVar100._4_4_;
            fVar164 = auVar100._8_4_;
            fVar165 = auVar100._12_4_;
            fVar144 = auVar100._16_4_;
            fVar152 = auVar100._20_4_;
            fVar153 = auVar100._24_4_;
            auVar36._4_4_ = fVar163 * fVar163 * fVar163 * auVar81._4_4_ * -0.5;
            auVar36._0_4_ = fVar156 * fVar156 * fVar156 * auVar81._0_4_ * -0.5;
            auVar36._8_4_ = fVar164 * fVar164 * fVar164 * auVar81._8_4_ * -0.5;
            auVar36._12_4_ = fVar165 * fVar165 * fVar165 * auVar81._12_4_ * -0.5;
            auVar36._16_4_ = fVar144 * fVar144 * fVar144 * -0.0;
            auVar36._20_4_ = fVar152 * fVar152 * fVar152 * -0.0;
            auVar36._24_4_ = fVar153 * fVar153 * fVar153 * -0.0;
            auVar36._28_4_ = auVar110._28_4_;
            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar100 = vfmadd231ps_avx512vl(auVar36,auVar98,auVar100);
            auVar37._4_4_ = auVar110._4_4_ * auVar100._4_4_;
            auVar37._0_4_ = auVar110._0_4_ * auVar100._0_4_;
            auVar37._8_4_ = auVar110._8_4_ * auVar100._8_4_;
            auVar37._12_4_ = auVar110._12_4_ * auVar100._12_4_;
            auVar37._16_4_ = auVar110._16_4_ * auVar100._16_4_;
            auVar37._20_4_ = auVar110._20_4_ * auVar100._20_4_;
            auVar37._24_4_ = auVar110._24_4_ * auVar100._24_4_;
            auVar37._28_4_ = 0;
            auVar38._4_4_ = auVar100._4_4_ * -auVar109._4_4_;
            auVar38._0_4_ = auVar100._0_4_ * -auVar109._0_4_;
            auVar38._8_4_ = auVar100._8_4_ * -auVar109._8_4_;
            auVar38._12_4_ = auVar100._12_4_ * -auVar109._12_4_;
            auVar38._16_4_ = auVar100._16_4_ * -auVar109._16_4_;
            auVar38._20_4_ = auVar100._20_4_ * -auVar109._20_4_;
            auVar38._24_4_ = auVar100._24_4_ * -auVar109._24_4_;
            auVar38._28_4_ = auVar110._28_4_;
            auVar97 = vmulps_avx512vl(auVar100,auVar95);
            auVar100 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar95);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar112,auVar112);
            auVar96 = vrsqrt14ps_avx512vl(auVar100);
            auVar100 = vmulps_avx512vl(auVar100,auVar183);
            fVar156 = auVar96._0_4_;
            fVar163 = auVar96._4_4_;
            fVar164 = auVar96._8_4_;
            fVar165 = auVar96._12_4_;
            fVar144 = auVar96._16_4_;
            fVar152 = auVar96._20_4_;
            fVar153 = auVar96._24_4_;
            auVar39._4_4_ = fVar163 * fVar163 * fVar163 * auVar100._4_4_;
            auVar39._0_4_ = fVar156 * fVar156 * fVar156 * auVar100._0_4_;
            auVar39._8_4_ = fVar164 * fVar164 * fVar164 * auVar100._8_4_;
            auVar39._12_4_ = fVar165 * fVar165 * fVar165 * auVar100._12_4_;
            auVar39._16_4_ = fVar144 * fVar144 * fVar144 * auVar100._16_4_;
            auVar39._20_4_ = fVar152 * fVar152 * fVar152 * auVar100._20_4_;
            auVar39._24_4_ = fVar153 * fVar153 * fVar153 * auVar100._24_4_;
            auVar39._28_4_ = auVar100._28_4_;
            auVar100 = vfmadd231ps_avx512vl(auVar39,auVar98,auVar96);
            auVar40._4_4_ = auVar112._4_4_ * auVar100._4_4_;
            auVar40._0_4_ = auVar112._0_4_ * auVar100._0_4_;
            auVar40._8_4_ = auVar112._8_4_ * auVar100._8_4_;
            auVar40._12_4_ = auVar112._12_4_ * auVar100._12_4_;
            auVar40._16_4_ = auVar112._16_4_ * auVar100._16_4_;
            auVar40._20_4_ = auVar112._20_4_ * auVar100._20_4_;
            auVar40._24_4_ = auVar112._24_4_ * auVar100._24_4_;
            auVar40._28_4_ = auVar96._28_4_;
            auVar41._4_4_ = auVar100._4_4_ * auVar99._4_4_;
            auVar41._0_4_ = auVar100._0_4_ * auVar99._0_4_;
            auVar41._8_4_ = auVar100._8_4_ * auVar99._8_4_;
            auVar41._12_4_ = auVar100._12_4_ * auVar99._12_4_;
            auVar41._16_4_ = auVar100._16_4_ * auVar99._16_4_;
            auVar41._20_4_ = auVar100._20_4_ * auVar99._20_4_;
            auVar41._24_4_ = auVar100._24_4_ * auVar99._24_4_;
            auVar41._28_4_ = auVar99._28_4_;
            auVar99 = vmulps_avx512vl(auVar100,auVar95);
            auVar81 = vfmadd213ps_fma(auVar37,auVar91,auVar89);
            auVar79 = vfmadd213ps_fma(auVar38,auVar91,auVar90);
            auVar98 = vfmadd213ps_avx512vl(auVar97,auVar91,auVar85);
            auVar96 = vfmadd213ps_avx512vl(auVar40,auVar94,auVar92);
            auVar18 = vfnmadd213ps_fma(auVar37,auVar91,auVar89);
            auVar73 = vfmadd213ps_fma(auVar41,auVar94,auVar93);
            auVar75 = vfnmadd213ps_fma(auVar38,auVar91,auVar90);
            auVar80 = vfmadd213ps_fma(auVar99,auVar94,auVar84);
            auVar78 = vfnmadd231ps_fma(auVar85,auVar91,auVar97);
            auVar82 = vfnmadd213ps_fma(auVar40,auVar94,auVar92);
            auVar76 = vfnmadd213ps_fma(auVar41,auVar94,auVar93);
            auVar77 = vfnmadd231ps_fma(auVar84,auVar94,auVar99);
            auVar84 = vsubps_avx512vl(auVar96,ZEXT1632(auVar18));
            auVar99 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar75));
            auVar100 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar78));
            auVar42._4_4_ = auVar99._4_4_ * auVar78._4_4_;
            auVar42._0_4_ = auVar99._0_4_ * auVar78._0_4_;
            auVar42._8_4_ = auVar99._8_4_ * auVar78._8_4_;
            auVar42._12_4_ = auVar99._12_4_ * auVar78._12_4_;
            auVar42._16_4_ = auVar99._16_4_ * 0.0;
            auVar42._20_4_ = auVar99._20_4_ * 0.0;
            auVar42._24_4_ = auVar99._24_4_ * 0.0;
            auVar42._28_4_ = auVar97._28_4_;
            auVar16 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar75),auVar100);
            auVar43._4_4_ = auVar100._4_4_ * auVar18._4_4_;
            auVar43._0_4_ = auVar100._0_4_ * auVar18._0_4_;
            auVar43._8_4_ = auVar100._8_4_ * auVar18._8_4_;
            auVar43._12_4_ = auVar100._12_4_ * auVar18._12_4_;
            auVar43._16_4_ = auVar100._16_4_ * 0.0;
            auVar43._20_4_ = auVar100._20_4_ * 0.0;
            auVar43._24_4_ = auVar100._24_4_ * 0.0;
            auVar43._28_4_ = auVar100._28_4_;
            auVar74 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar78),auVar84);
            auVar44._4_4_ = auVar75._4_4_ * auVar84._4_4_;
            auVar44._0_4_ = auVar75._0_4_ * auVar84._0_4_;
            auVar44._8_4_ = auVar75._8_4_ * auVar84._8_4_;
            auVar44._12_4_ = auVar75._12_4_ * auVar84._12_4_;
            auVar44._16_4_ = auVar84._16_4_ * 0.0;
            auVar44._20_4_ = auVar84._20_4_ * 0.0;
            auVar44._24_4_ = auVar84._24_4_ * 0.0;
            auVar44._28_4_ = auVar84._28_4_;
            auVar17 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar18),auVar99);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar17),auVar95,ZEXT1632(auVar74));
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,ZEXT1632(auVar16));
            uVar60 = vcmpps_avx512vl(auVar99,auVar95,2);
            bVar63 = (byte)uVar60;
            fVar71 = (float)((uint)(bVar63 & 1) * auVar81._0_4_ |
                            (uint)!(bool)(bVar63 & 1) * auVar82._0_4_);
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            fVar120 = (float)((uint)bVar10 * auVar81._4_4_ | (uint)!bVar10 * auVar82._4_4_);
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            fVar122 = (float)((uint)bVar10 * auVar81._8_4_ | (uint)!bVar10 * auVar82._8_4_);
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            fVar124 = (float)((uint)bVar10 * auVar81._12_4_ | (uint)!bVar10 * auVar82._12_4_);
            auVar86 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar122,CONCAT44(fVar120,fVar71))));
            fVar72 = (float)((uint)(bVar63 & 1) * auVar79._0_4_ |
                            (uint)!(bool)(bVar63 & 1) * auVar76._0_4_);
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            fVar121 = (float)((uint)bVar10 * auVar79._4_4_ | (uint)!bVar10 * auVar76._4_4_);
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            fVar123 = (float)((uint)bVar10 * auVar79._8_4_ | (uint)!bVar10 * auVar76._8_4_);
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            fVar125 = (float)((uint)bVar10 * auVar79._12_4_ | (uint)!bVar10 * auVar76._12_4_);
            auVar87 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar72))));
            auVar113._0_4_ =
                 (float)((uint)(bVar63 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar77._0_4_);
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar10 * auVar98._4_4_ | (uint)!bVar10 * auVar77._4_4_);
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar10 * auVar98._8_4_ | (uint)!bVar10 * auVar77._8_4_);
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar10 * auVar98._12_4_ | (uint)!bVar10 * auVar77._12_4_);
            fVar156 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar98._16_4_);
            auVar113._16_4_ = fVar156;
            fVar164 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar98._20_4_);
            auVar113._20_4_ = fVar164;
            fVar163 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar98._24_4_);
            auVar113._24_4_ = fVar163;
            iVar1 = (uint)(byte)(uVar60 >> 7) * auVar98._28_4_;
            auVar113._28_4_ = iVar1;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar18),auVar96);
            auVar114._0_4_ =
                 (uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar16._0_4_;
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar114._4_4_ = (uint)bVar10 * auVar99._4_4_ | (uint)!bVar10 * auVar16._4_4_;
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar114._8_4_ = (uint)bVar10 * auVar99._8_4_ | (uint)!bVar10 * auVar16._8_4_;
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar114._12_4_ = (uint)bVar10 * auVar99._12_4_ | (uint)!bVar10 * auVar16._12_4_;
            auVar114._16_4_ = (uint)((byte)(uVar60 >> 4) & 1) * auVar99._16_4_;
            auVar114._20_4_ = (uint)((byte)(uVar60 >> 5) & 1) * auVar99._20_4_;
            auVar114._24_4_ = (uint)((byte)(uVar60 >> 6) & 1) * auVar99._24_4_;
            auVar114._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar99._28_4_;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar73));
            auVar115._0_4_ =
                 (float)((uint)(bVar63 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar81._0_4_);
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar10 * auVar99._4_4_ | (uint)!bVar10 * auVar81._4_4_);
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar10 * auVar99._8_4_ | (uint)!bVar10 * auVar81._8_4_);
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar10 * auVar99._12_4_ | (uint)!bVar10 * auVar81._12_4_);
            fVar165 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar99._16_4_);
            auVar115._16_4_ = fVar165;
            fVar144 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar99._20_4_);
            auVar115._20_4_ = fVar144;
            fVar152 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar99._24_4_);
            auVar115._24_4_ = fVar152;
            auVar115._28_4_ = (uint)(byte)(uVar60 >> 7) * auVar99._28_4_;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar80));
            auVar116._0_4_ =
                 (float)((uint)(bVar63 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar79._0_4_);
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar10 * auVar99._4_4_ | (uint)!bVar10 * auVar79._4_4_);
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar10 * auVar99._8_4_ | (uint)!bVar10 * auVar79._8_4_);
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar10 * auVar99._12_4_ | (uint)!bVar10 * auVar79._12_4_);
            fVar154 = (float)((uint)((byte)(uVar60 >> 4) & 1) * auVar99._16_4_);
            auVar116._16_4_ = fVar154;
            fVar155 = (float)((uint)((byte)(uVar60 >> 5) & 1) * auVar99._20_4_);
            auVar116._20_4_ = fVar155;
            fVar153 = (float)((uint)((byte)(uVar60 >> 6) & 1) * auVar99._24_4_);
            auVar116._24_4_ = fVar153;
            iVar2 = (uint)(byte)(uVar60 >> 7) * auVar99._28_4_;
            auVar116._28_4_ = iVar2;
            auVar117._0_4_ =
                 (uint)(bVar63 & 1) * (int)auVar18._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar96._0_4_
            ;
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar10 * (int)auVar18._4_4_ | (uint)!bVar10 * auVar96._4_4_;
            bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar10 * (int)auVar18._8_4_ | (uint)!bVar10 * auVar96._8_4_;
            bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar10 * (int)auVar18._12_4_ | (uint)!bVar10 * auVar96._12_4_;
            auVar117._16_4_ = (uint)!(bool)((byte)(uVar60 >> 4) & 1) * auVar96._16_4_;
            auVar117._20_4_ = (uint)!(bool)((byte)(uVar60 >> 5) & 1) * auVar96._20_4_;
            auVar117._24_4_ = (uint)!(bool)((byte)(uVar60 >> 6) & 1) * auVar96._24_4_;
            auVar117._28_4_ = (uint)!SUB81(uVar60 >> 7,0) * auVar96._28_4_;
            bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar60 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar60 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar60 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar60 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar96 = vsubps_avx512vl(auVar117,auVar86);
            auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar75._12_4_ |
                                                     (uint)!bVar14 * auVar73._12_4_,
                                                     CONCAT48((uint)bVar12 * (int)auVar75._8_4_ |
                                                              (uint)!bVar12 * auVar73._8_4_,
                                                              CONCAT44((uint)bVar10 *
                                                                       (int)auVar75._4_4_ |
                                                                       (uint)!bVar10 * auVar73._4_4_
                                                                       ,(uint)(bVar63 & 1) *
                                                                        (int)auVar75._0_4_ |
                                                                        (uint)!(bool)(bVar63 & 1) *
                                                                        auVar73._0_4_)))),auVar87);
            auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar78._12_4_ |
                                                    (uint)!bVar15 * auVar80._12_4_,
                                                    CONCAT48((uint)bVar13 * (int)auVar78._8_4_ |
                                                             (uint)!bVar13 * auVar80._8_4_,
                                                             CONCAT44((uint)bVar11 *
                                                                      (int)auVar78._4_4_ |
                                                                      (uint)!bVar11 * auVar80._4_4_,
                                                                      (uint)(bVar63 & 1) *
                                                                      (int)auVar78._0_4_ |
                                                                      (uint)!(bool)(bVar63 & 1) *
                                                                      auVar80._0_4_)))),auVar113);
            auVar97 = vsubps_avx(auVar86,auVar114);
            auVar84 = vsubps_avx(auVar87,auVar115);
            auVar85 = vsubps_avx(auVar113,auVar116);
            auVar45._4_4_ = auVar98._4_4_ * fVar120;
            auVar45._0_4_ = auVar98._0_4_ * fVar71;
            auVar45._8_4_ = auVar98._8_4_ * fVar122;
            auVar45._12_4_ = auVar98._12_4_ * fVar124;
            auVar45._16_4_ = auVar98._16_4_ * 0.0;
            auVar45._20_4_ = auVar98._20_4_ * 0.0;
            auVar45._24_4_ = auVar98._24_4_ * 0.0;
            auVar45._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar45,auVar113,auVar96);
            auVar151._0_4_ = fVar72 * auVar96._0_4_;
            auVar151._4_4_ = fVar121 * auVar96._4_4_;
            auVar151._8_4_ = fVar123 * auVar96._8_4_;
            auVar151._12_4_ = fVar125 * auVar96._12_4_;
            auVar151._16_4_ = auVar96._16_4_ * 0.0;
            auVar151._20_4_ = auVar96._20_4_ * 0.0;
            auVar151._24_4_ = auVar96._24_4_ * 0.0;
            auVar151._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar151,auVar86,auVar100);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar95,ZEXT1632(auVar81));
            auVar161._0_4_ = auVar100._0_4_ * auVar113._0_4_;
            auVar161._4_4_ = auVar100._4_4_ * auVar113._4_4_;
            auVar161._8_4_ = auVar100._8_4_ * auVar113._8_4_;
            auVar161._12_4_ = auVar100._12_4_ * auVar113._12_4_;
            auVar161._16_4_ = auVar100._16_4_ * fVar156;
            auVar161._20_4_ = auVar100._20_4_ * fVar164;
            auVar161._24_4_ = auVar100._24_4_ * fVar163;
            auVar161._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar161,auVar87,auVar98);
            auVar88 = vfmadd231ps_avx512vl(auVar99,auVar95,ZEXT1632(auVar81));
            auVar99 = vmulps_avx512vl(auVar85,auVar114);
            auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar116);
            auVar46._4_4_ = auVar84._4_4_ * auVar116._4_4_;
            auVar46._0_4_ = auVar84._0_4_ * auVar116._0_4_;
            auVar46._8_4_ = auVar84._8_4_ * auVar116._8_4_;
            auVar46._12_4_ = auVar84._12_4_ * auVar116._12_4_;
            auVar46._16_4_ = auVar84._16_4_ * fVar154;
            auVar46._20_4_ = auVar84._20_4_ * fVar155;
            auVar46._24_4_ = auVar84._24_4_ * fVar153;
            auVar46._28_4_ = iVar2;
            auVar81 = vfmsub231ps_fma(auVar46,auVar115,auVar85);
            auVar162._0_4_ = auVar115._0_4_ * auVar97._0_4_;
            auVar162._4_4_ = auVar115._4_4_ * auVar97._4_4_;
            auVar162._8_4_ = auVar115._8_4_ * auVar97._8_4_;
            auVar162._12_4_ = auVar115._12_4_ * auVar97._12_4_;
            auVar162._16_4_ = fVar165 * auVar97._16_4_;
            auVar162._20_4_ = fVar144 * auVar97._20_4_;
            auVar162._24_4_ = fVar152 * auVar97._24_4_;
            auVar162._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar162,auVar84,auVar114);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar95,auVar99);
            auVar89 = vfmadd231ps_avx512vl(auVar99,auVar95,ZEXT1632(auVar81));
            auVar99 = vmaxps_avx(auVar88,auVar89);
            uVar19 = vcmpps_avx512vl(auVar99,auVar95,2);
            local_670 = local_670 & (byte)uVar19;
            if (local_670 == 0) {
LAB_01b36b84:
              local_670 = 0;
            }
            else {
              auVar47._4_4_ = auVar85._4_4_ * auVar100._4_4_;
              auVar47._0_4_ = auVar85._0_4_ * auVar100._0_4_;
              auVar47._8_4_ = auVar85._8_4_ * auVar100._8_4_;
              auVar47._12_4_ = auVar85._12_4_ * auVar100._12_4_;
              auVar47._16_4_ = auVar85._16_4_ * auVar100._16_4_;
              auVar47._20_4_ = auVar85._20_4_ * auVar100._20_4_;
              auVar47._24_4_ = auVar85._24_4_ * auVar100._24_4_;
              auVar47._28_4_ = auVar99._28_4_;
              auVar73 = vfmsub231ps_fma(auVar47,auVar84,auVar98);
              auVar48._4_4_ = auVar98._4_4_ * auVar97._4_4_;
              auVar48._0_4_ = auVar98._0_4_ * auVar97._0_4_;
              auVar48._8_4_ = auVar98._8_4_ * auVar97._8_4_;
              auVar48._12_4_ = auVar98._12_4_ * auVar97._12_4_;
              auVar48._16_4_ = auVar98._16_4_ * auVar97._16_4_;
              auVar48._20_4_ = auVar98._20_4_ * auVar97._20_4_;
              auVar48._24_4_ = auVar98._24_4_ * auVar97._24_4_;
              auVar48._28_4_ = auVar98._28_4_;
              auVar79 = vfmsub231ps_fma(auVar48,auVar96,auVar85);
              auVar49._4_4_ = auVar84._4_4_ * auVar96._4_4_;
              auVar49._0_4_ = auVar84._0_4_ * auVar96._0_4_;
              auVar49._8_4_ = auVar84._8_4_ * auVar96._8_4_;
              auVar49._12_4_ = auVar84._12_4_ * auVar96._12_4_;
              auVar49._16_4_ = auVar84._16_4_ * auVar96._16_4_;
              auVar49._20_4_ = auVar84._20_4_ * auVar96._20_4_;
              auVar49._24_4_ = auVar84._24_4_ * auVar96._24_4_;
              auVar49._28_4_ = auVar84._28_4_;
              auVar80 = vfmsub231ps_fma(auVar49,auVar97,auVar100);
              auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar80));
              auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar73),auVar95);
              auVar100 = vrcp14ps_avx512vl(auVar99);
              auVar24._8_4_ = 0x3f800000;
              auVar24._0_8_ = &DAT_3f8000003f800000;
              auVar24._12_4_ = 0x3f800000;
              auVar24._16_4_ = 0x3f800000;
              auVar24._20_4_ = 0x3f800000;
              auVar24._24_4_ = 0x3f800000;
              auVar24._28_4_ = 0x3f800000;
              auVar98 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar24);
              auVar81 = vfmadd132ps_fma(auVar98,auVar100,auVar100);
              auVar50._4_4_ = auVar80._4_4_ * auVar113._4_4_;
              auVar50._0_4_ = auVar80._0_4_ * auVar113._0_4_;
              auVar50._8_4_ = auVar80._8_4_ * auVar113._8_4_;
              auVar50._12_4_ = auVar80._12_4_ * auVar113._12_4_;
              auVar50._16_4_ = fVar156 * 0.0;
              auVar50._20_4_ = fVar164 * 0.0;
              auVar50._24_4_ = fVar163 * 0.0;
              auVar50._28_4_ = iVar1;
              auVar79 = vfmadd231ps_fma(auVar50,auVar87,ZEXT1632(auVar79));
              auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar86,ZEXT1632(auVar73));
              fVar156 = auVar81._0_4_;
              fVar163 = auVar81._4_4_;
              fVar164 = auVar81._8_4_;
              fVar165 = auVar81._12_4_;
              auVar100 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar165,
                                            CONCAT48(auVar79._8_4_ * fVar164,
                                                     CONCAT44(auVar79._4_4_ * fVar163,
                                                              auVar79._0_4_ * fVar156))));
              auVar59._4_4_ = uStack_55c;
              auVar59._0_4_ = local_560;
              auVar59._8_4_ = uStack_558;
              auVar59._12_4_ = uStack_554;
              auVar59._16_4_ = uStack_550;
              auVar59._20_4_ = uStack_54c;
              auVar59._24_4_ = uStack_548;
              auVar59._28_4_ = uStack_544;
              uVar19 = vcmpps_avx512vl(auVar100,auVar59,0xd);
              uVar126 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar25._4_4_ = uVar126;
              auVar25._0_4_ = uVar126;
              auVar25._8_4_ = uVar126;
              auVar25._12_4_ = uVar126;
              auVar25._16_4_ = uVar126;
              auVar25._20_4_ = uVar126;
              auVar25._24_4_ = uVar126;
              auVar25._28_4_ = uVar126;
              uVar20 = vcmpps_avx512vl(auVar100,auVar25,2);
              local_670 = (byte)uVar19 & (byte)uVar20 & local_670;
              if (local_670 == 0) goto LAB_01b36b84;
              uVar19 = vcmpps_avx512vl(auVar99,auVar95,4);
              if ((local_670 & (byte)uVar19) == 0) {
                local_670 = 0;
              }
              else {
                local_670 = local_670 & (byte)uVar19;
                fVar144 = auVar88._0_4_ * fVar156;
                fVar152 = auVar88._4_4_ * fVar163;
                auVar51._4_4_ = fVar152;
                auVar51._0_4_ = fVar144;
                fVar153 = auVar88._8_4_ * fVar164;
                auVar51._8_4_ = fVar153;
                fVar154 = auVar88._12_4_ * fVar165;
                auVar51._12_4_ = fVar154;
                fVar155 = auVar88._16_4_ * 0.0;
                auVar51._16_4_ = fVar155;
                fVar71 = auVar88._20_4_ * 0.0;
                auVar51._20_4_ = fVar71;
                fVar72 = auVar88._24_4_ * 0.0;
                auVar51._24_4_ = fVar72;
                auVar51._28_4_ = auVar88._28_4_;
                fVar156 = auVar89._0_4_ * fVar156;
                fVar163 = auVar89._4_4_ * fVar163;
                auVar52._4_4_ = fVar163;
                auVar52._0_4_ = fVar156;
                fVar164 = auVar89._8_4_ * fVar164;
                auVar52._8_4_ = fVar164;
                fVar165 = auVar89._12_4_ * fVar165;
                auVar52._12_4_ = fVar165;
                fVar120 = auVar89._16_4_ * 0.0;
                auVar52._16_4_ = fVar120;
                fVar121 = auVar89._20_4_ * 0.0;
                auVar52._20_4_ = fVar121;
                fVar122 = auVar89._24_4_ * 0.0;
                auVar52._24_4_ = fVar122;
                auVar52._28_4_ = auVar89._28_4_;
                auVar170._8_4_ = 0x3f800000;
                auVar170._0_8_ = &DAT_3f8000003f800000;
                auVar170._12_4_ = 0x3f800000;
                auVar170._16_4_ = 0x3f800000;
                auVar170._20_4_ = 0x3f800000;
                auVar170._24_4_ = 0x3f800000;
                auVar170._28_4_ = 0x3f800000;
                auVar99 = vsubps_avx(auVar170,auVar51);
                local_8c0._0_4_ =
                     (uint)(bVar63 & 1) * (int)fVar144 | (uint)!(bool)(bVar63 & 1) * auVar99._0_4_;
                bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
                local_8c0._4_4_ = (uint)bVar10 * (int)fVar152 | (uint)!bVar10 * auVar99._4_4_;
                bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
                local_8c0._8_4_ = (uint)bVar10 * (int)fVar153 | (uint)!bVar10 * auVar99._8_4_;
                bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
                local_8c0._12_4_ = (uint)bVar10 * (int)fVar154 | (uint)!bVar10 * auVar99._12_4_;
                bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
                local_8c0._16_4_ = (uint)bVar10 * (int)fVar155 | (uint)!bVar10 * auVar99._16_4_;
                bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
                local_8c0._20_4_ = (uint)bVar10 * (int)fVar71 | (uint)!bVar10 * auVar99._20_4_;
                bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
                local_8c0._24_4_ = (uint)bVar10 * (int)fVar72 | (uint)!bVar10 * auVar99._24_4_;
                bVar10 = SUB81(uVar60 >> 7,0);
                local_8c0._28_4_ = (uint)bVar10 * auVar88._28_4_ | (uint)!bVar10 * auVar99._28_4_;
                auVar99 = vsubps_avx(auVar170,auVar52);
                local_580._0_4_ =
                     (uint)(bVar63 & 1) * (int)fVar156 | (uint)!(bool)(bVar63 & 1) * auVar99._0_4_;
                bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
                local_580._4_4_ = (uint)bVar10 * (int)fVar163 | (uint)!bVar10 * auVar99._4_4_;
                bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
                local_580._8_4_ = (uint)bVar10 * (int)fVar164 | (uint)!bVar10 * auVar99._8_4_;
                bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
                local_580._12_4_ = (uint)bVar10 * (int)fVar165 | (uint)!bVar10 * auVar99._12_4_;
                bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
                local_580._16_4_ = (uint)bVar10 * (int)fVar120 | (uint)!bVar10 * auVar99._16_4_;
                bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
                local_580._20_4_ = (uint)bVar10 * (int)fVar121 | (uint)!bVar10 * auVar99._20_4_;
                bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
                local_580._24_4_ = (uint)bVar10 * (int)fVar122 | (uint)!bVar10 * auVar99._24_4_;
                bVar10 = SUB81(uVar60 >> 7,0);
                local_580._28_4_ = (uint)bVar10 * auVar89._28_4_ | (uint)!bVar10 * auVar99._28_4_;
                local_8e0 = auVar100;
              }
            }
            auVar184 = ZEXT3264(local_940);
            if (local_670 != 0) {
              auVar99 = vsubps_avx(auVar94,auVar91);
              auVar81 = vfmadd213ps_fma(auVar99,local_8c0,auVar91);
              uVar126 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar26._4_4_ = uVar126;
              auVar26._0_4_ = uVar126;
              auVar26._8_4_ = uVar126;
              auVar26._12_4_ = uVar126;
              auVar26._16_4_ = uVar126;
              auVar26._20_4_ = uVar126;
              auVar26._24_4_ = uVar126;
              auVar26._28_4_ = uVar126;
              auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                           CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                    CONCAT44(auVar81._4_4_ +
                                                                             auVar81._4_4_,
                                                                             auVar81._0_4_ +
                                                                             auVar81._0_4_)))),
                                        auVar26);
              uVar19 = vcmpps_avx512vl(local_8e0,auVar99,6);
              local_670 = local_670 & (byte)uVar19;
              if (local_670 != 0) {
                auVar134._8_4_ = 0xbf800000;
                auVar134._0_8_ = 0xbf800000bf800000;
                auVar134._12_4_ = 0xbf800000;
                auVar134._16_4_ = 0xbf800000;
                auVar134._20_4_ = 0xbf800000;
                auVar134._24_4_ = 0xbf800000;
                auVar134._28_4_ = 0xbf800000;
                auVar27._8_4_ = 0x40000000;
                auVar27._0_8_ = 0x4000000040000000;
                auVar27._12_4_ = 0x40000000;
                auVar27._16_4_ = 0x40000000;
                auVar27._20_4_ = 0x40000000;
                auVar27._24_4_ = 0x40000000;
                auVar27._28_4_ = 0x40000000;
                local_700 = vfmadd132ps_avx512vl(local_580,auVar134,auVar27);
                local_580 = local_700;
                auVar99 = local_580;
                local_6c0 = (undefined4)lVar69;
                local_6b0 = local_990._0_8_;
                uStack_6a8 = local_990._8_8_;
                local_6a0 = local_790._0_8_;
                uStack_698 = local_790._8_8_;
                local_690 = local_7b0._0_8_;
                uStack_688 = local_7b0._8_8_;
                local_680 = local_7a0._0_8_;
                uStack_678 = local_7a0._8_8_;
                pGVar8 = (context->scene->geometries).items[uVar68].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                  bVar63 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar63 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_3e0 = vmovdqa64_avx512vl(auVar119._0_32_);
                  auVar81 = vcvtsi2ss_avx512f(auVar185._0_16_,local_6c0);
                  fVar156 = auVar81._0_4_;
                  local_660[0] = (fVar156 + local_8c0._0_4_ + 0.0) * (float)local_5a0;
                  local_660[1] = (fVar156 + local_8c0._4_4_ + 1.0) * local_5a0._4_4_;
                  local_660[2] = (fVar156 + local_8c0._8_4_ + 2.0) * fStack_598;
                  local_660[3] = (fVar156 + local_8c0._12_4_ + 3.0) * fStack_594;
                  fStack_650 = (fVar156 + local_8c0._16_4_ + 4.0) * fStack_590;
                  fStack_64c = (fVar156 + local_8c0._20_4_ + 5.0) * fStack_58c;
                  fStack_648 = (fVar156 + local_8c0._24_4_ + 6.0) * fStack_588;
                  fStack_644 = fVar156 + local_8c0._28_4_ + 7.0;
                  local_580._0_8_ = local_700._0_8_;
                  local_580._8_8_ = local_700._8_8_;
                  local_580._16_8_ = local_700._16_8_;
                  local_580._24_8_ = local_700._24_8_;
                  local_640 = local_580._0_8_;
                  uStack_638 = local_580._8_8_;
                  uStack_630 = local_580._16_8_;
                  uStack_628 = local_580._24_8_;
                  local_620 = local_8e0;
                  local_900 = local_790._0_8_;
                  uStack_8f8 = local_790._8_8_;
                  uVar60 = 0;
                  uVar67 = (ulong)local_670;
                  for (uVar66 = uVar67; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000
                      ) {
                    uVar60 = uVar60 + 1;
                  }
                  local_910 = local_7b0._0_4_;
                  fStack_90c = local_7b0._4_4_;
                  fStack_908 = local_7b0._8_4_;
                  fStack_904 = local_7b0._12_4_;
                  local_520 = local_7a0._0_8_;
                  uStack_518 = local_7a0._8_8_;
                  local_500._0_4_ = 1;
                  local_720 = local_8c0;
                  local_6e0 = local_8e0;
                  local_6bc = iVar7;
                  local_580 = auVar99;
                  do {
                    local_9a0 = *(undefined4 *)(ray + k * 4 + 0x200);
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar60]));
                    local_1c0 = vbroadcastss_avx512f
                                          (ZEXT416(*(uint *)((long)&local_640 + uVar60 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar60 * 4);
                    local_9d0.context = context->user;
                    fVar165 = local_200._0_4_;
                    fVar163 = 1.0 - fVar165;
                    fVar156 = fVar163 * fVar163 * -3.0;
                    auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * fVar163)),
                                              ZEXT416((uint)(fVar165 * fVar163)),ZEXT416(0xc0000000)
                                             );
                    auVar79 = vfmsub132ss_fma(ZEXT416((uint)(fVar165 * fVar163)),
                                              ZEXT416((uint)(fVar165 * fVar165)),ZEXT416(0x40000000)
                                             );
                    fVar163 = auVar81._0_4_ * 3.0;
                    fVar164 = auVar79._0_4_ * 3.0;
                    fVar165 = fVar165 * fVar165 * 3.0;
                    auVar168._0_4_ = fVar165 * (float)local_520;
                    auVar168._4_4_ = fVar165 * local_520._4_4_;
                    auVar168._8_4_ = fVar165 * (float)uStack_518;
                    auVar168._12_4_ = fVar165 * uStack_518._4_4_;
                    auVar131._4_4_ = fVar164;
                    auVar131._0_4_ = fVar164;
                    auVar131._8_4_ = fVar164;
                    auVar131._12_4_ = fVar164;
                    auVar55._4_4_ = fStack_90c;
                    auVar55._0_4_ = local_910;
                    auVar55._8_4_ = fStack_908;
                    auVar55._12_4_ = fStack_904;
                    auVar81 = vfmadd132ps_fma(auVar131,auVar168,auVar55);
                    auVar149._4_4_ = fVar163;
                    auVar149._0_4_ = fVar163;
                    auVar149._8_4_ = fVar163;
                    auVar149._12_4_ = fVar163;
                    auVar57._8_8_ = uStack_8f8;
                    auVar57._0_8_ = local_900;
                    auVar81 = vfmadd132ps_fma(auVar149,auVar81,auVar57);
                    auVar132._4_4_ = fVar156;
                    auVar132._0_4_ = fVar156;
                    auVar132._8_4_ = fVar156;
                    auVar132._12_4_ = fVar156;
                    auVar81 = vfmadd132ps_fma(auVar132,auVar81,local_990);
                    auVar135 = vbroadcastss_avx512f(auVar81);
                    auVar188 = vbroadcastss_avx512f(ZEXT416(1));
                    local_280 = vpermps_avx512f(auVar188,ZEXT1664(auVar81));
                    auVar188 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar188,ZEXT1664(auVar81));
                    local_2c0[0] = (RTCHitN)auVar135[0];
                    local_2c0[1] = (RTCHitN)auVar135[1];
                    local_2c0[2] = (RTCHitN)auVar135[2];
                    local_2c0[3] = (RTCHitN)auVar135[3];
                    local_2c0[4] = (RTCHitN)auVar135[4];
                    local_2c0[5] = (RTCHitN)auVar135[5];
                    local_2c0[6] = (RTCHitN)auVar135[6];
                    local_2c0[7] = (RTCHitN)auVar135[7];
                    local_2c0[8] = (RTCHitN)auVar135[8];
                    local_2c0[9] = (RTCHitN)auVar135[9];
                    local_2c0[10] = (RTCHitN)auVar135[10];
                    local_2c0[0xb] = (RTCHitN)auVar135[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar135[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar135[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar135[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar135[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar135[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar135[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar135[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar135[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar135[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar135[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar135[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar135[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar135[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar135[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar135[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar135[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar135[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar135[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar135[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar135[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar135[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar135[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar135[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar135[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar135[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar135[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar135[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar135[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar135[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar135[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar135[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar135[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar135[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar135[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar135[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar135[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar135[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar135[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar135[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar135[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar135[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar135[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar135[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar135[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar135[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar135[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar135[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar135[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar135[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar135[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar135[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar135[0x3f];
                    local_180 = local_480._0_8_;
                    uStack_178 = local_480._8_8_;
                    uStack_170 = local_480._16_8_;
                    uStack_168 = local_480._24_8_;
                    uStack_160 = local_480._32_8_;
                    uStack_158 = local_480._40_8_;
                    uStack_150 = local_480._48_8_;
                    uStack_148 = local_480._56_8_;
                    auVar135 = vmovdqa64_avx512f(local_440);
                    local_140 = vmovdqa64_avx512f(auVar135);
                    vpcmpeqd_avx2(auVar135._0_32_,auVar135._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_9d0.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_9d0.context)->instPrimID[0]));
                    local_600 = local_300;
                    local_9d0.valid = (int *)local_600;
                    local_9d0.geometryUserPtr = pGVar8->userPtr;
                    local_9d0.hit = local_2c0;
                    local_9d0.N = 0x10;
                    pRVar62 = (RayK<16> *)pGVar8->occlusionFilterN;
                    local_4c0._0_8_ = uVar60;
                    uVar66 = uVar60;
                    local_9d0.ray = (RTCRayN *)ray;
                    if (pRVar62 != (RayK<16> *)0x0) {
                      pRVar62 = (RayK<16> *)(*(code *)pRVar62)(&local_9d0);
                      uVar66 = local_4c0._0_8_;
                    }
                    auVar135 = vmovdqa64_avx512f(local_600);
                    uVar19 = vptestmd_avx512f(auVar135,auVar135);
                    if ((short)uVar19 != 0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_9d0);
                        uVar66 = local_4c0._0_8_;
                      }
                      auVar81 = auVar185._0_16_;
                      auVar135 = vmovdqa64_avx512f(local_600);
                      uVar60 = vptestmd_avx512f(auVar135,auVar135);
                      auVar188 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar10 = (bool)((byte)uVar60 & 1);
                      auVar135._0_4_ =
                           (uint)bVar10 * auVar188._0_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x200);
                      bVar10 = (bool)((byte)(uVar60 >> 1) & 1);
                      auVar135._4_4_ =
                           (uint)bVar10 * auVar188._4_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x204);
                      bVar10 = (bool)((byte)(uVar60 >> 2) & 1);
                      auVar135._8_4_ =
                           (uint)bVar10 * auVar188._8_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x208);
                      bVar10 = (bool)((byte)(uVar60 >> 3) & 1);
                      auVar135._12_4_ =
                           (uint)bVar10 * auVar188._12_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x20c);
                      bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
                      auVar135._16_4_ =
                           (uint)bVar10 * auVar188._16_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x210);
                      bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
                      auVar135._20_4_ =
                           (uint)bVar10 * auVar188._20_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x214);
                      bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
                      auVar135._24_4_ =
                           (uint)bVar10 * auVar188._24_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x218);
                      bVar10 = (bool)((byte)(uVar60 >> 7) & 1);
                      auVar135._28_4_ =
                           (uint)bVar10 * auVar188._28_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x21c);
                      bVar10 = (bool)((byte)(uVar60 >> 8) & 1);
                      auVar135._32_4_ =
                           (uint)bVar10 * auVar188._32_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x220);
                      bVar10 = (bool)((byte)(uVar60 >> 9) & 1);
                      auVar135._36_4_ =
                           (uint)bVar10 * auVar188._36_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x224);
                      bVar10 = (bool)((byte)(uVar60 >> 10) & 1);
                      auVar135._40_4_ =
                           (uint)bVar10 * auVar188._40_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x228);
                      bVar10 = (bool)((byte)(uVar60 >> 0xb) & 1);
                      auVar135._44_4_ =
                           (uint)bVar10 * auVar188._44_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x22c);
                      bVar10 = (bool)((byte)(uVar60 >> 0xc) & 1);
                      auVar135._48_4_ =
                           (uint)bVar10 * auVar188._48_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x230);
                      bVar10 = (bool)((byte)(uVar60 >> 0xd) & 1);
                      auVar135._52_4_ =
                           (uint)bVar10 * auVar188._52_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x234);
                      bVar10 = (bool)((byte)(uVar60 >> 0xe) & 1);
                      auVar135._56_4_ =
                           (uint)bVar10 * auVar188._56_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x238);
                      bVar10 = SUB81(uVar60 >> 0xf,0);
                      auVar135._60_4_ =
                           (uint)bVar10 * auVar188._60_4_ |
                           (uint)!bVar10 * *(int *)(local_9d0.ray + 0x23c);
                      *(undefined1 (*) [64])(local_9d0.ray + 0x200) = auVar135;
                      pRVar62 = (RayK<16> *)local_9d0.ray;
                      if ((short)uVar60 != 0) break;
                    }
                    auVar81 = auVar185._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_9a0;
                    uVar60 = 0;
                    uVar67 = uVar67 ^ 1L << (uVar66 & 0x3f);
                    for (uVar66 = uVar67; (uVar66 & 1) == 0;
                        uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                      uVar60 = uVar60 + 1;
                    }
                    local_500._0_4_ = (int)CONCAT71((int7)((ulong)pRVar62 >> 8),uVar67 != 0);
                  } while (uVar67 != 0);
                  bVar63 = local_500[0] & 1;
                  auVar81 = vxorps_avx512vl(auVar81,auVar81);
                  auVar185 = ZEXT1664(auVar81);
                  auVar192 = ZEXT3264(local_7e0);
                  auVar187 = ZEXT3264(local_740);
                  auVar186 = ZEXT3264(local_800);
                  auVar184 = ZEXT3264(local_940);
                  auVar188 = ZEXT3264(local_820);
                  auVar189 = ZEXT3264(local_840);
                  auVar190 = ZEXT3264(local_860);
                  auVar191 = ZEXT3264(local_880);
                  auVar135 = ZEXT3264(local_760);
                  auVar193 = ZEXT3264(local_780);
                  auVar99 = vmovdqa64_avx512vl(local_3e0);
                  auVar119 = ZEXT3264(auVar99);
                }
                bVar65 = (bool)(bVar65 | bVar63);
              }
            }
          }
          lVar69 = lVar69 + 8;
        } while ((int)lVar69 < iVar7);
      }
      if (bVar65 != false) {
        return local_a11;
      }
      uVar126 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar21._4_4_ = uVar126;
      auVar21._0_4_ = uVar126;
      auVar21._8_4_ = uVar126;
      auVar21._12_4_ = uVar126;
      uVar19 = vcmpps_avx512vl(local_510,auVar21,2);
      uVar68 = (uint)uVar70 & (uint)uVar70 + 0xf & (uint)uVar19;
      uVar70 = (ulong)uVar68;
      local_a11 = uVar68 != 0;
    } while (local_a11);
  }
  return local_a11;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }